

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_godunov_extrap_vel_to_faces_3D.cpp
# Opt level: O0

void Godunov::ExtrapVelToFacesOnBox
               (Box *bx,int ncomp,Box *xbx,Box *ybx,Box *zbx,Array4<double> *qx,Array4<double> *qy,
               Array4<double> *qz,Array4<const_double> *q,Array4<const_double> *u_ad,
               Array4<const_double> *v_ad,Array4<const_double> *w_ad,Array4<double> *Imx,
               Array4<double> *Imy,Array4<double> *Imz,Array4<double> *Ipx,Array4<double> *Ipy,
               Array4<double> *Ipz,Array4<const_double> *f,Box *domain,Real *dx_arr,Real l_dt,
               BCRec *pbc,bool l_use_forces_in_trans,Real *p)

{
  uint uVar1;
  double *a_p;
  undefined8 uVar2;
  Long LVar3;
  Long LVar4;
  Box *pBVar5;
  Box *pBVar6;
  Box *pBVar7;
  anon_class_640_16_60eb45bb *in_RCX;
  int *in_RDX;
  int in_ESI;
  Long *in_RDI;
  int *in_R8;
  void *in_R9;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  void *in_stack_00000008;
  void *in_stack_00000010;
  undefined8 *in_stack_00000018;
  undefined8 *in_stack_00000020;
  undefined8 *in_stack_00000028;
  undefined8 *in_stack_00000030;
  undefined8 *in_stack_00000038;
  undefined8 *in_stack_00000040;
  undefined8 *in_stack_00000048;
  undefined8 *in_stack_00000050;
  undefined8 *in_stack_00000058;
  int *in_stack_00000060;
  undefined8 *in_stack_00000068;
  Long *in_stack_00000070;
  Long *in_stack_00000078;
  byte in_stack_00000088;
  double *in_stack_00000090;
  Box bx_6;
  Array4<double> yxlo;
  Box bx_5;
  Array4<double> xylo;
  Box zbxtmp;
  Box bx_4;
  Array4<double> zxlo;
  Box bx_3;
  Array4<double> xzlo;
  Box ybxtmp;
  Box bx_2;
  Array4<double> zylo;
  Box bx_1;
  Array4<double> yzlo;
  Box xbxtmp;
  Box result;
  Array4<double> divu;
  Array4<double> zedge;
  Array4<double> yedge;
  Array4<double> xedge;
  Array4<double> zhi;
  Array4<double> zlo;
  Array4<double> yhi;
  Array4<double> ylo;
  Array4<double> xhi;
  Array4<double> xlo;
  Box zebox;
  Box yebox;
  Box xebox;
  Real dz;
  Real dy;
  Real dx;
  Dim3 dhi;
  Dim3 dlo;
  int i_2;
  int i_1;
  int i;
  anon_class_560_13_b36ffc0b *f2;
  int iVar8;
  int in_stack_ffffffffffffcaf4;
  anon_class_496_12_8bd2d905 *in_stack_ffffffffffffcb00;
  undefined8 in_stack_ffffffffffffcb08;
  int ncomp1;
  Box *in_stack_ffffffffffffcb10;
  Box *in_stack_ffffffffffffcb20;
  int in_stack_ffffffffffffcb28;
  anon_class_640_16_9a82a438 *in_stack_ffffffffffffcb30;
  anon_class_640_16_60eb45bb *f_00;
  Box *in_stack_ffffffffffffcb38;
  undefined1 auStack_33f0 [64];
  Long local_33b0;
  Long local_33a8;
  undefined1 auStack_33a0 [64];
  undefined1 auStack_3360 [64];
  Long local_3320;
  undefined1 auStack_3318 [64];
  undefined1 auStack_32d8 [64];
  undefined1 auStack_3298 [64];
  byte local_3258;
  undefined1 auStack_3250 [64];
  undefined1 auStack_3210 [64];
  Long local_31d0;
  undefined4 local_31c8;
  Long local_31c4;
  int local_31bc;
  undefined1 auStack_31b8 [72];
  Long local_3170;
  Long local_3168;
  undefined1 auStack_3160 [64];
  undefined1 auStack_3120 [64];
  undefined1 auStack_30e0 [64];
  undefined1 auStack_30a0 [64];
  undefined1 auStack_3060 [64];
  undefined1 auStack_3020 [64];
  undefined1 auStack_2fe0 [64];
  Long local_2fa0;
  undefined4 local_2f98;
  Long local_2f94;
  int local_2f8c;
  undefined1 auStack_2f88 [72];
  Long local_2f40;
  Long local_2f38;
  undefined1 auStack_2f30 [64];
  undefined1 auStack_2ef0 [64];
  undefined1 auStack_2eb0 [64];
  undefined1 auStack_2e70 [64];
  undefined1 auStack_2e30 [64];
  undefined1 auStack_2df0 [64];
  undefined1 auStack_2db0 [64];
  Long local_2d70;
  undefined4 local_2d68;
  Long local_2d64;
  int local_2d5c;
  undefined1 auStack_2d58 [124];
  undefined8 local_2cdc;
  undefined8 local_2cd4;
  undefined8 local_2ccc;
  uint local_2cc4;
  Array4<double> local_2cc0;
  undefined8 local_2c7c;
  undefined8 local_2c74;
  undefined8 local_2c6c;
  uint local_2c64;
  Array4<double> local_2c60;
  Box local_2c20;
  double *local_2c04;
  undefined8 local_2bfc;
  undefined8 local_2bf4;
  uint local_2bec;
  undefined1 auStack_2be0 [64];
  Long local_2ba0;
  Long local_2b98;
  undefined1 auStack_2b90 [64];
  undefined1 auStack_2b50 [64];
  double *local_2b10;
  undefined1 auStack_2b08 [64];
  undefined1 auStack_2ac8 [64];
  undefined1 auStack_2a88 [64];
  byte local_2a48;
  undefined1 auStack_2a40 [64];
  undefined1 auStack_2a00 [64];
  Long local_29c0;
  undefined4 local_29b8;
  Long local_29b4;
  int local_29ac;
  undefined1 auStack_29a8 [72];
  Long local_2960;
  Long local_2958;
  undefined1 auStack_2950 [64];
  undefined1 auStack_2910 [64];
  undefined1 auStack_28d0 [64];
  undefined1 auStack_2890 [64];
  undefined1 auStack_2850 [64];
  undefined1 auStack_2810 [64];
  undefined1 auStack_27d0 [64];
  Long local_2790;
  undefined4 local_2788;
  Long local_2784;
  int local_277c;
  undefined1 auStack_2778 [72];
  Long local_2730;
  double *local_2728;
  undefined1 auStack_2720 [64];
  undefined1 auStack_26e0 [64];
  undefined1 auStack_26a0 [64];
  undefined1 auStack_2660 [64];
  undefined1 auStack_2620 [64];
  undefined1 auStack_25e0 [64];
  undefined1 auStack_25a0 [64];
  Long local_2560;
  undefined4 local_2558;
  Long local_2554;
  int local_254c;
  undefined1 auStack_2548 [124];
  undefined8 local_24cc;
  undefined8 local_24c4;
  undefined8 local_24bc;
  uint local_24b4;
  Array4<double> local_24b0;
  undefined8 local_246c;
  undefined8 local_2464;
  undefined8 local_245c;
  uint local_2454;
  Array4<double> local_2450;
  BCRec *local_2410;
  undefined8 local_2408;
  Long local_2400;
  IndexType local_23f8;
  Long local_23f4;
  undefined8 local_23ec;
  undefined8 local_23e4;
  uint local_23dc;
  undefined1 auStack_23d0 [64];
  Long local_2390;
  Long local_2388;
  undefined1 auStack_2380 [64];
  undefined1 auStack_2340 [64];
  double *local_2300;
  undefined1 auStack_22f8 [64];
  undefined1 auStack_22b8 [64];
  undefined1 auStack_2278 [64];
  byte local_2238;
  undefined1 auStack_2230 [64];
  undefined1 auStack_21f0 [64];
  Long local_21b0;
  undefined4 local_21a8;
  Long local_21a4;
  int local_219c;
  undefined1 auStack_2198 [72];
  Long local_2150;
  double *local_2148;
  undefined1 auStack_2140 [64];
  undefined1 auStack_2100 [64];
  undefined1 auStack_20c0 [64];
  undefined1 auStack_2080 [64];
  undefined1 auStack_2040 [64];
  undefined1 auStack_2000 [64];
  undefined1 auStack_1fc0 [64];
  Long local_1f80;
  undefined4 local_1f78;
  Long local_1f74;
  int local_1f6c;
  undefined1 auStack_1f68 [72];
  Long local_1f20;
  Long local_1f18;
  undefined1 auStack_1f10 [64];
  undefined1 auStack_1ed0 [64];
  undefined1 auStack_1e90 [64];
  undefined1 auStack_1e50 [64];
  undefined1 auStack_1e10 [64];
  undefined1 auStack_1dd0 [64];
  undefined1 auStack_1d90 [64];
  Long local_1d50;
  undefined4 local_1d48;
  Long local_1d44;
  int local_1d3c;
  undefined1 auStack_1d38 [124];
  undefined1 local_1cbc [12];
  int iStack_1cb0;
  undefined8 local_1cac;
  uint local_1ca4;
  Array4<double> local_1ca0;
  undefined1 local_1c5c [12];
  int iStack_1c50;
  undefined8 local_1c4c;
  uint local_1c44;
  Array4<double> local_1c40;
  Box local_1c00;
  undefined1 local_1be4 [16];
  undefined8 local_1bd4;
  uint local_1bcc;
  undefined1 local_1bc8 [96];
  Box local_1b68;
  Array4<double> local_1b48;
  undefined8 local_1b08;
  undefined8 uStack_1b00;
  undefined8 local_1af8;
  undefined8 uStack_1af0;
  undefined8 local_1ae8;
  undefined8 uStack_1ae0;
  undefined8 local_1ad8;
  undefined8 uStack_1ad0;
  undefined8 local_1ac8;
  undefined8 uStack_1ac0;
  undefined8 local_1ab8;
  undefined8 uStack_1ab0;
  undefined8 local_1aa8;
  undefined8 uStack_1aa0;
  undefined8 local_1a98;
  undefined8 uStack_1a90;
  undefined8 local_1a88;
  undefined8 uStack_1a80;
  undefined8 local_1a78;
  undefined8 uStack_1a70;
  undefined8 local_1a68;
  undefined8 uStack_1a60;
  undefined8 local_1a58;
  undefined8 uStack_1a50;
  undefined1 local_1a48 [32];
  undefined8 uStack_1a28;
  undefined4 uStack_1a20;
  undefined4 local_1a1c;
  undefined4 uStack_1a18;
  undefined8 uStack_1a14;
  undefined8 local_1a08;
  undefined8 uStack_1a00;
  undefined8 local_19f8;
  undefined8 uStack_19f0;
  undefined8 uStack_19e8;
  undefined4 uStack_19e0;
  undefined4 local_19dc;
  undefined4 uStack_19d8;
  undefined8 uStack_19d4;
  byte local_19c8;
  Long local_19c0;
  undefined8 local_19b8;
  undefined8 uStack_19b0;
  undefined8 local_19a8;
  undefined8 uStack_19a0;
  undefined8 uStack_1998;
  undefined4 uStack_1990;
  undefined4 local_198c;
  undefined4 uStack_1988;
  undefined8 uStack_1984;
  undefined8 local_1978;
  undefined8 uStack_1970;
  undefined8 local_1968;
  undefined8 uStack_1960;
  undefined8 uStack_1958;
  undefined4 uStack_1950;
  undefined4 local_194c;
  undefined4 uStack_1948;
  undefined8 uStack_1944;
  undefined8 local_1930;
  undefined8 uStack_1928;
  undefined8 local_1920;
  undefined8 uStack_1918;
  undefined8 uStack_1910;
  undefined4 uStack_1908;
  undefined4 local_1904;
  undefined4 uStack_1900;
  undefined8 uStack_18fc;
  Long local_18f0;
  undefined4 local_18e8;
  Long local_18e4;
  int local_18dc;
  double *local_18d8;
  Long LStack_18d0;
  Long local_18c8;
  long lStack_18c0;
  Dim3 aDStack_18b8 [2];
  int iStack_18a0;
  double *local_1898;
  Long LStack_1890;
  Long local_1888;
  long lStack_1880;
  Dim3 aDStack_1878 [2];
  int iStack_1860;
  undefined8 local_1858;
  undefined8 uStack_1850;
  undefined8 local_1848;
  undefined8 uStack_1840;
  undefined8 uStack_1838;
  undefined4 uStack_1830;
  undefined4 local_182c;
  undefined4 uStack_1828;
  undefined8 uStack_1824;
  undefined8 local_1818;
  undefined8 uStack_1810;
  undefined8 local_1808;
  undefined8 uStack_1800;
  undefined8 uStack_17f8;
  undefined4 uStack_17f0;
  undefined4 local_17ec;
  undefined4 uStack_17e8;
  undefined8 uStack_17e4;
  byte local_17d8;
  Long local_17d0;
  undefined8 local_17c8;
  undefined8 uStack_17c0;
  undefined8 local_17b8;
  undefined8 uStack_17b0;
  undefined8 uStack_17a8;
  undefined4 uStack_17a0;
  undefined4 local_179c;
  undefined4 uStack_1798;
  undefined8 uStack_1794;
  undefined8 local_1788;
  undefined8 uStack_1780;
  undefined8 local_1778;
  undefined8 uStack_1770;
  undefined8 uStack_1768;
  undefined4 uStack_1760;
  undefined4 local_175c;
  undefined4 uStack_1758;
  undefined8 uStack_1754;
  undefined8 local_1740;
  undefined8 uStack_1738;
  undefined8 local_1730;
  undefined8 uStack_1728;
  undefined8 uStack_1720;
  undefined4 uStack_1718;
  undefined4 local_1714;
  undefined4 uStack_1710;
  undefined8 uStack_170c;
  Long local_1700;
  undefined4 local_16f8;
  Long local_16f4;
  int local_16ec;
  double *local_16e8;
  Long LStack_16e0;
  Long local_16d8;
  long lStack_16d0;
  Dim3 aDStack_16c8 [2];
  int iStack_16b0;
  double *local_16a8;
  Long LStack_16a0;
  Long local_1698;
  long lStack_1690;
  Dim3 aDStack_1688 [2];
  int iStack_1670;
  undefined8 local_1668;
  undefined8 uStack_1660;
  undefined8 local_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  undefined4 uStack_1640;
  undefined4 local_163c;
  undefined4 uStack_1638;
  undefined8 uStack_1634;
  undefined8 local_1628;
  undefined8 uStack_1620;
  undefined8 local_1618;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  undefined4 uStack_1600;
  undefined4 local_15fc;
  undefined4 uStack_15f8;
  undefined8 uStack_15f4;
  byte local_15e8;
  Long local_15e0;
  undefined8 local_15d8;
  undefined8 uStack_15d0;
  undefined8 local_15c8;
  undefined8 uStack_15c0;
  undefined8 uStack_15b8;
  undefined4 uStack_15b0;
  undefined4 local_15ac;
  undefined4 uStack_15a8;
  undefined8 uStack_15a4;
  undefined8 local_1598;
  undefined8 uStack_1590;
  undefined8 local_1588;
  undefined8 uStack_1580;
  undefined8 uStack_1578;
  undefined4 uStack_1570;
  undefined4 local_156c;
  undefined4 uStack_1568;
  undefined8 uStack_1564;
  undefined8 local_1550;
  undefined8 uStack_1548;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined4 uStack_1528;
  undefined4 local_1524;
  undefined4 uStack_1520;
  undefined8 uStack_151c;
  Long local_1510;
  undefined4 local_1508;
  Long local_1504;
  int local_14fc;
  double *local_14f8;
  Long LStack_14f0;
  Long local_14e8;
  long lStack_14e0;
  Dim3 aDStack_14d8 [2];
  int iStack_14c0;
  double *local_14b8;
  Long LStack_14b0;
  Long local_14a8;
  long lStack_14a0;
  Dim3 aDStack_1498 [2];
  int iStack_1480;
  Array4<double> local_1478;
  Array4<double> local_1438;
  Array4<double> local_13f8;
  Array4<double> local_13b8;
  Array4<double> local_1378;
  Array4<double> local_1338;
  Box local_12f4;
  undefined1 local_12d8 [48];
  Long local_12a8;
  Long local_12a0;
  int local_1298;
  Dim3 local_1294;
  int iStack_1288;
  int local_1284;
  int iStack_1280;
  uint local_127c;
  Box local_1278;
  undefined1 local_125c [12];
  int iStack_1250;
  int local_124c;
  int iStack_1248;
  uint local_1244;
  double *local_1240;
  Long local_1238;
  Long local_1230;
  Long local_1228;
  int local_1220;
  Long local_1214;
  int local_120c;
  Long local_1208;
  undefined4 local_1200;
  Long local_11f8;
  undefined4 local_11f0;
  byte local_11e9;
  Long local_11e8;
  void *local_11e0;
  int *local_11d8;
  anon_class_640_16_60eb45bb *local_11d0;
  int *local_11c8;
  int local_11bc;
  Long *local_11b8;
  undefined4 local_11ac;
  Long *local_11a8;
  Dim3 local_11a0;
  Dim3 local_118c;
  double *local_1180;
  int local_1178;
  double *local_1170;
  int local_1168;
  undefined4 local_1164;
  undefined8 *local_1160;
  double *local_1158;
  Dim3 local_1150;
  Dim3 local_113c;
  double *local_1130;
  int local_1128;
  double *local_1120;
  int local_1118;
  int local_1114;
  undefined8 *local_1110;
  double *local_1108;
  Dim3 local_1100;
  Dim3 local_10ec;
  Long local_10e0;
  int local_10d8;
  Dim3 local_10d0;
  int local_10c4;
  undefined8 *local_10c0;
  double *local_10b8;
  Dim3 local_10b0;
  Dim3 local_109c;
  Long local_1090;
  int local_1088;
  Dim3 local_1080;
  undefined4 local_1074;
  undefined8 *local_1070;
  double *local_1068;
  Dim3 local_1060;
  Dim3 local_104c;
  Dim3 local_1040;
  Dim3 local_1030;
  undefined4 local_1024;
  undefined1 *local_1020;
  double *local_1018;
  Dim3 local_1010;
  Dim3 local_ffc;
  Dim3 local_ff0;
  Dim3 local_fe0;
  undefined4 local_fd4;
  undefined1 *local_fd0;
  double *local_fc8;
  Dim3 local_fc0;
  Dim3 local_fac;
  Long local_fa0;
  int local_f98;
  Dim3 local_f90;
  undefined4 local_f84;
  Box *local_f80;
  double *local_f78;
  Dim3 local_f70;
  Dim3 local_f60;
  BCRec *local_f50;
  int local_f48;
  BCRec *local_f40;
  int local_f38;
  int local_f34;
  anon_class_560_13_b36ffc0b *local_f30;
  double *local_f28;
  Dim3 local_f20;
  Dim3 local_f10;
  BCRec *local_f00;
  int local_ef8;
  BCRec *local_ef0;
  int local_ee8;
  int local_ee4;
  anon_class_560_13_b36ffc0b *local_ee0;
  double *local_ed8;
  Dim3 local_ed0;
  Dim3 local_ec0;
  Dim3 local_eb0;
  Dim3 local_ea0;
  int local_e94;
  Dim3 *local_e90;
  double *local_e88;
  Dim3 local_e80;
  Dim3 local_e70;
  Dim3 local_e60;
  Dim3 local_e50;
  int local_e44;
  Dim3 *local_e40;
  double *local_e38;
  Dim3 local_e30;
  Dim3 local_e20;
  Dim3 local_e10;
  Dim3 local_e00;
  int local_df4;
  undefined1 *local_df0;
  double *local_de8;
  Dim3 local_de0;
  Dim3 local_dd0;
  Dim3 local_dc0;
  Dim3 local_db0;
  int local_da4;
  undefined1 *local_da0;
  double *local_d98;
  Array4<double> *local_d90;
  Array4<double> *local_d88;
  Array4<double> *local_d80;
  Array4<double> *local_d78;
  Array4<double> *local_d70;
  Array4<double> *local_d68;
  undefined4 local_d5c;
  Box *local_d58;
  undefined4 local_d4c;
  Box *local_d48;
  undefined4 local_d3c;
  Box *local_d38;
  Long local_d30;
  undefined4 local_d28;
  undefined4 local_d14;
  undefined4 uStack_d10;
  undefined4 local_d0c;
  Long local_d08;
  int local_d00;
  undefined4 local_cec;
  undefined4 uStack_ce8;
  int local_ce4;
  int local_ca4;
  Box *local_ca0;
  int local_c94;
  Box *local_c90;
  int local_c84;
  Box *local_c80;
  undefined4 local_c74;
  double **local_c70;
  undefined4 local_c64;
  undefined8 *local_c60;
  undefined4 local_c54;
  double **local_c50;
  undefined4 local_c44;
  undefined8 *local_c40;
  undefined4 local_c34;
  Long *local_c30;
  undefined4 local_c24;
  undefined8 *local_c20;
  undefined4 local_c14;
  Long *local_c10;
  undefined4 local_c04;
  undefined8 *local_c00;
  undefined4 local_bf4;
  undefined1 *local_bf0;
  undefined4 local_be4;
  undefined1 *local_be0;
  undefined4 local_bd4;
  undefined1 *local_bd0;
  undefined4 local_bc4;
  undefined1 *local_bc0;
  undefined4 local_bb8;
  undefined4 local_bb4;
  int *local_bb0;
  undefined4 local_ba8;
  undefined4 local_ba4;
  int *local_ba0;
  undefined4 local_b98;
  undefined4 local_b94;
  long local_b90;
  undefined4 local_b88;
  undefined4 local_b84;
  long local_b80;
  undefined4 local_b78;
  undefined4 local_b74;
  long local_b70;
  undefined4 local_b68;
  undefined4 local_b64;
  long local_b60;
  undefined4 local_b58;
  int local_b54;
  IntVect *local_b50;
  undefined4 local_b48;
  int local_b44;
  long local_b40;
  undefined4 local_b38;
  int local_b34;
  IntVect *local_b30;
  undefined4 local_b28;
  undefined4 local_b24;
  IntVect *local_b20;
  undefined4 local_b18;
  undefined4 local_b14;
  IntVect *local_b10;
  undefined4 local_b08;
  undefined4 local_b04;
  IntVect *local_b00;
  undefined4 local_af4;
  uint *local_af0;
  undefined4 local_ae4;
  uint *local_ae0;
  undefined4 local_ad4;
  uint *local_ad0;
  undefined4 local_ac4;
  uint *local_ac0;
  undefined4 local_ab4;
  uint *local_ab0;
  undefined4 local_aa4;
  uint *local_aa0;
  int local_a94;
  IndexType *local_a90;
  int local_a84;
  IndexType *local_a80;
  int local_a74;
  IndexType *local_a70;
  undefined4 local_a64;
  IndexType *local_a60;
  undefined4 local_a54;
  IndexType *local_a50;
  undefined4 local_a44;
  IndexType *local_a40;
  undefined4 local_a34;
  uint *local_a30;
  undefined4 local_a24;
  uint *local_a20;
  undefined4 local_a14;
  uint *local_a10;
  undefined4 local_a04;
  uint *local_a00;
  undefined4 local_9f4;
  uint *local_9f0;
  undefined4 local_9e4;
  uint *local_9e0;
  undefined4 local_9d4;
  IndexType *local_9d0;
  undefined4 local_9c4;
  IndexType *local_9c0;
  undefined4 local_9b4;
  IndexType *local_9b0;
  undefined4 local_9a4;
  IndexType *local_9a0;
  undefined4 local_994;
  IndexType *local_990;
  undefined4 local_984;
  IndexType *local_980;
  int local_974;
  IndexType *local_970;
  int local_964;
  IndexType *local_960;
  int local_954;
  IndexType *local_950;
  undefined4 local_944;
  uint *local_940;
  undefined4 local_934;
  uint *local_930;
  undefined4 local_924;
  uint *local_920;
  undefined4 local_914;
  uint *local_910;
  undefined4 local_904;
  uint *local_900;
  undefined4 local_8f4;
  uint *local_8f0;
  undefined4 local_8e8;
  undefined4 local_8e4;
  undefined4 local_8e0;
  undefined4 local_8dc;
  undefined4 local_8d8;
  undefined4 local_8d4;
  int local_8d0;
  int local_8cc;
  int local_8c8;
  undefined4 local_8c4;
  undefined4 local_8c0;
  undefined4 local_8bc;
  undefined4 local_8b8;
  undefined4 local_8b4;
  undefined4 local_8b0;
  undefined4 local_8ac;
  undefined4 local_8a8;
  undefined4 local_8a4;
  undefined4 local_8a0;
  undefined4 local_89c;
  undefined4 local_898;
  undefined4 local_894;
  undefined4 *local_890;
  undefined4 local_884;
  undefined4 *local_880;
  undefined4 local_874;
  Long *local_870;
  undefined4 local_864;
  undefined4 local_854;
  undefined4 local_844;
  IndexType *local_838;
  IndexType *local_830;
  IndexType *local_828;
  Dim3 local_820;
  undefined1 *local_810;
  int local_808;
  int iStack_804;
  int local_800;
  undefined4 local_7fc;
  undefined1 *local_7f8;
  undefined4 local_7ec;
  undefined1 *local_7e8;
  undefined4 local_7dc;
  undefined1 *local_7d8;
  Dim3 local_7d0;
  undefined1 *local_7c0;
  int local_7b8;
  int iStack_7b4;
  int local_7b0;
  undefined4 local_7ac;
  undefined1 *local_7a8;
  undefined4 local_79c;
  undefined1 *local_798;
  undefined4 local_78c;
  undefined1 *local_788;
  Dim3 local_780;
  Dim3 *local_770;
  int local_768;
  int iStack_764;
  int local_760;
  undefined4 local_75c;
  Dim3 *local_758;
  undefined4 local_74c;
  Dim3 *local_748;
  undefined4 local_73c;
  Dim3 *local_738;
  Dim3 local_730;
  Dim3 *local_720;
  int local_718;
  int iStack_714;
  int local_710;
  undefined4 local_70c;
  Dim3 *local_708;
  undefined4 local_6fc;
  Dim3 *local_6f8;
  undefined4 local_6ec;
  Dim3 *local_6e8;
  BCRec *local_6e0;
  int local_6d8;
  anon_class_560_13_b36ffc0b *local_6d0;
  undefined4 local_6c8;
  undefined4 uStack_6c4;
  int local_6c0;
  undefined4 local_6bc;
  anon_class_560_13_b36ffc0b *local_6b8;
  undefined4 local_6ac;
  anon_class_560_13_b36ffc0b *local_6a8;
  undefined4 local_69c;
  anon_class_560_13_b36ffc0b *local_698;
  BCRec *local_690;
  int local_688;
  anon_class_560_13_b36ffc0b *local_680;
  undefined4 local_678;
  undefined4 uStack_674;
  int local_670;
  undefined4 local_66c;
  anon_class_560_13_b36ffc0b *local_668;
  undefined4 local_65c;
  anon_class_560_13_b36ffc0b *local_658;
  undefined4 local_64c;
  anon_class_560_13_b36ffc0b *local_648;
  Long local_640;
  int local_638;
  Box *local_630;
  int local_628;
  int iStack_624;
  int local_620;
  undefined4 local_61c;
  Box *local_618;
  undefined4 local_60c;
  Box *local_608;
  undefined4 local_5fc;
  Box *local_5f8;
  Dim3 local_5f0;
  undefined1 *local_5e0;
  int local_5d8;
  int iStack_5d4;
  int local_5d0;
  undefined4 local_5cc;
  undefined1 *local_5c8;
  undefined4 local_5bc;
  undefined1 *local_5b8;
  undefined4 local_5ac;
  undefined1 *local_5a8;
  Dim3 local_5a0;
  undefined1 *local_590;
  int local_588;
  int iStack_584;
  int local_580;
  undefined4 local_57c;
  undefined1 *local_578;
  undefined4 local_56c;
  undefined1 *local_568;
  undefined4 local_55c;
  undefined1 *local_558;
  Long local_550;
  int local_548;
  undefined8 *local_540;
  undefined4 local_538;
  undefined4 uStack_534;
  int local_530;
  undefined4 local_52c;
  undefined8 *local_528;
  undefined4 local_51c;
  undefined8 *local_518;
  undefined4 local_50c;
  undefined8 *local_508;
  Long local_500;
  int local_4f8;
  undefined8 *local_4f0;
  undefined4 local_4e8;
  undefined4 uStack_4e4;
  int local_4e0;
  undefined4 local_4dc;
  undefined8 *local_4d8;
  undefined4 local_4cc;
  undefined8 *local_4c8;
  undefined4 local_4bc;
  undefined8 *local_4b8;
  double *local_4b0;
  int local_4a8;
  undefined8 *local_4a0;
  undefined4 local_498;
  undefined4 uStack_494;
  int local_490;
  undefined4 local_48c;
  undefined8 *local_488;
  undefined4 local_47c;
  undefined8 *local_478;
  undefined4 local_46c;
  undefined8 *local_468;
  double *local_460;
  int local_458;
  undefined8 *local_450;
  undefined4 local_448;
  undefined4 uStack_444;
  int local_440;
  undefined4 local_43c;
  undefined8 *local_438;
  undefined4 local_42c;
  undefined8 *local_428;
  undefined4 local_41c;
  undefined8 *local_418;
  Dim3 local_410;
  undefined1 *local_400;
  int local_3f8;
  int iStack_3f4;
  int local_3f0;
  undefined4 local_3ec;
  int *local_3e8;
  undefined4 local_3dc;
  int *local_3d8;
  undefined4 local_3cc;
  int *local_3c8;
  Dim3 local_3c0;
  undefined1 *local_3b0;
  int local_3a8;
  int iStack_3a4;
  int local_3a0;
  undefined4 local_39c;
  int *local_398;
  undefined4 local_38c;
  int *local_388;
  undefined4 local_37c;
  int *local_378;
  Dim3 local_370;
  Dim3 *local_360;
  int local_358;
  int iStack_354;
  int local_350;
  undefined4 local_34c;
  int *local_348;
  undefined4 local_33c;
  int *local_338;
  undefined4 local_32c;
  int *local_328;
  Dim3 local_320;
  Dim3 *local_310;
  int local_308;
  int iStack_304;
  int local_300;
  undefined4 local_2fc;
  int *local_2f8;
  undefined4 local_2ec;
  int *local_2e8;
  undefined4 local_2dc;
  int *local_2d8;
  Dim3 local_2d0;
  anon_class_560_13_b36ffc0b *local_2c0;
  int local_2b8;
  int iStack_2b4;
  int local_2b0;
  undefined4 local_2ac;
  undefined1 *local_2a8;
  undefined4 local_29c;
  undefined1 *local_298;
  undefined4 local_28c;
  undefined1 *local_288;
  Dim3 local_280;
  anon_class_560_13_b36ffc0b *local_270;
  int local_268;
  int iStack_264;
  int local_260;
  undefined4 local_25c;
  undefined1 *local_258;
  undefined4 local_24c;
  undefined1 *local_248;
  undefined4 local_23c;
  undefined1 *local_238;
  Dim3 local_230;
  Box *local_220;
  int local_218;
  int iStack_214;
  int local_210;
  undefined4 local_20c;
  IntVect *local_208;
  undefined4 local_1fc;
  IntVect *local_1f8;
  undefined4 local_1ec;
  IntVect *local_1e8;
  Dim3 local_1e0;
  undefined1 *local_1d0;
  int local_1c8;
  int iStack_1c4;
  int local_1c0;
  undefined4 local_1bc;
  int *local_1b8;
  undefined4 local_1ac;
  int *local_1a8;
  undefined4 local_19c;
  int *local_198;
  Dim3 local_190;
  undefined1 *local_180;
  int local_178;
  int iStack_174;
  int local_170;
  undefined4 local_16c;
  int *local_168;
  undefined4 local_15c;
  int *local_158;
  undefined4 local_14c;
  int *local_148;
  Dim3 local_140;
  undefined8 *local_130;
  int local_128;
  int iStack_124;
  int local_120;
  undefined4 local_11c;
  long local_118;
  undefined4 local_10c;
  long local_108;
  undefined4 local_fc;
  long local_f8;
  Dim3 local_f0;
  undefined8 *local_e0;
  int local_d8;
  int iStack_d4;
  int local_d0;
  undefined4 local_cc;
  long local_c8;
  undefined4 local_bc;
  long local_b8;
  undefined4 local_ac;
  long local_a8;
  Dim3 local_a0;
  undefined8 *local_90;
  int local_88;
  int iStack_84;
  int local_80;
  undefined4 local_7c;
  long local_78;
  undefined4 local_6c;
  long local_68;
  undefined4 local_5c;
  long local_58;
  Dim3 local_50;
  undefined8 *local_40;
  int local_38;
  int iStack_34;
  int local_30;
  undefined4 local_2c;
  long local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  ncomp1 = (int)((ulong)in_stack_ffffffffffffcb08 >> 0x20);
  local_11e8 = CONCAT44(in_XMM0_Db,in_XMM0_Da);
  local_11e9 = in_stack_00000088 & 1;
  local_844 = 0;
  local_d14 = (undefined4)*in_stack_00000070;
  local_854 = 1;
  uStack_d10 = *(undefined4 *)((long)in_stack_00000070 + 4);
  local_1208 = *in_stack_00000070;
  local_864 = 2;
  local_1200 = (undefined4)in_stack_00000070[1];
  local_870 = (Long *)((long)in_stack_00000070 + 0xc);
  local_874 = 0;
  local_cec = *(undefined4 *)local_870;
  local_880 = (undefined4 *)((long)in_stack_00000070 + 0xc);
  local_884 = 1;
  uStack_ce8 = (undefined4)in_stack_00000070[2];
  local_1228 = *local_870;
  local_890 = (undefined4 *)((long)in_stack_00000070 + 0xc);
  local_894 = 2;
  local_1220 = *(int *)((long)in_stack_00000070 + 0x14);
  local_1230 = *in_stack_00000078;
  local_1238 = in_stack_00000078[1];
  local_1240 = (double *)in_stack_00000078[2];
  local_1278.smallend.vect._0_8_ = *in_RDI;
  local_1278._8_8_ = in_RDI[1];
  local_1278.bigend.vect._4_8_ = in_RDI[2];
  local_1278.btype.itype = *(uint *)(in_RDI + 3);
  local_1214 = local_1228;
  local_120c = local_1220;
  local_11f8 = local_1208;
  local_11f0 = local_1200;
  local_11e0 = in_R9;
  local_11d8 = in_R8;
  local_11d0 = in_RCX;
  local_11c8 = in_RDX;
  local_11bc = in_ESI;
  local_11b8 = in_RDI;
  local_d30 = local_1208;
  local_d28 = local_1200;
  local_d0c = local_1200;
  local_d08 = local_1228;
  local_d00 = local_1220;
  local_ce4 = local_1220;
  pBVar5 = amrex::Box::grow(&local_1278,1,1);
  local_d38 = amrex::Box::grow(pBVar5,2,1);
  local_d3c = 0;
  local_a60 = &local_d38->btype;
  local_a64 = 0;
  local_984 = 0;
  local_8c4 = 0;
  if ((local_a60->itype & 1) == 0) {
    local_b20 = &local_d38->bigend;
    local_b24 = 0;
    local_b28 = 1;
    local_b20->vect[0] = local_b20->vect[0] + 1;
    local_9d0 = &local_d38->btype;
    local_9d4 = 0;
    local_8b0 = 0;
    local_9d0->itype = local_9d0->itype | 1;
  }
  local_125c._0_4_ = (local_d38->smallend).vect[0];
  local_125c._4_4_ = (local_d38->smallend).vect[1];
  unique0x00012000 = *(undefined8 *)((local_d38->smallend).vect + 2);
  local_124c = (local_d38->bigend).vect[1];
  iStack_1248 = (local_d38->bigend).vect[2];
  local_1244 = (local_d38->btype).itype;
  local_12d8._40_8_ = *local_11b8;
  local_12a8 = local_11b8[1];
  local_12a0 = local_11b8[2];
  local_1298 = (int)local_11b8[3];
  local_980 = local_a60;
  pBVar5 = amrex::Box::grow((Box *)(local_12d8 + 0x28),0,1);
  local_d48 = amrex::Box::grow(pBVar5,2,1);
  local_d4c = 1;
  local_a50 = &local_d48->btype;
  local_a54 = 1;
  local_994 = 1;
  local_8c0 = 1;
  if ((local_a50->itype & 2) == 0) {
    local_b10 = &local_d48->bigend;
    local_b14 = 1;
    local_b18 = 1;
    (local_d48->bigend).vect[1] = (local_d48->bigend).vect[1] + 1;
    local_9c0 = &local_d48->btype;
    local_9c4 = 1;
    local_8b4 = 1;
    local_9c0->itype = local_9c0->itype | 2;
  }
  local_1294.x = (local_d48->smallend).vect[0];
  local_1294.y = (local_d48->smallend).vect[1];
  unique0x00012000 = *(undefined8 *)((local_d48->smallend).vect + 2);
  _local_1284 = *(undefined8 *)((local_d48->bigend).vect + 1);
  local_127c = (local_d48->btype).itype;
  local_12f4.smallend.vect._0_8_ = *local_11b8;
  local_12f4._8_8_ = local_11b8[1];
  local_12f4.bigend.vect._4_8_ = local_11b8[2];
  local_12f4.btype.itype = *(uint *)(local_11b8 + 3);
  local_990 = local_a50;
  pBVar5 = amrex::Box::grow(&local_12f4,0,1);
  local_d58 = amrex::Box::grow(pBVar5,1,1);
  local_d5c = 2;
  local_a40 = &local_d58->btype;
  local_a44 = 2;
  local_9a4 = 2;
  local_8bc = 2;
  if ((local_a40->itype & 4) == 0) {
    local_b00 = &local_d58->bigend;
    local_b04 = 2;
    local_b08 = 1;
    (local_d58->bigend).vect[2] = (local_d58->bigend).vect[2] + 1;
    local_9b0 = &local_d58->btype;
    local_9b4 = 2;
    local_8b8 = 2;
    local_9b0->itype = local_9b0->itype | 4;
  }
  local_12d8._0_8_ = *(undefined8 *)(local_d58->smallend).vect;
  uVar2 = *(undefined8 *)((local_d58->smallend).vect + 2);
  local_12d8._20_8_ = *(undefined8 *)((local_d58->bigend).vect + 2);
  local_12d8._16_4_ = (undefined4)((ulong)*(undefined8 *)(local_d58->bigend).vect >> 0x20);
  local_12d8._8_4_ = (undefined4)uVar2;
  local_12d8._12_4_ = (undefined4)((ulong)uVar2 >> 0x20);
  local_d98 = in_stack_00000090;
  local_da4 = local_11bc;
  local_7dc = 0;
  local_808 = local_125c._0_4_;
  local_7ec = 1;
  iStack_804 = local_125c._4_4_;
  local_dc0.x = local_125c._0_4_;
  local_dc0.y = local_125c._4_4_;
  local_7fc = 2;
  local_dc0.z = local_125c._8_4_;
  local_3c8 = &iStack_1250;
  local_3cc = 0;
  local_3f8 = iStack_1250 + 1;
  local_3d8 = &iStack_1250;
  local_3dc = 1;
  iStack_3f4 = local_124c + 1;
  local_3e8 = &iStack_1250;
  local_3ec = 2;
  local_de0.z = iStack_1248 + 1;
  local_de0.y = iStack_3f4;
  local_de0.x = local_3f8;
  local_dd0._0_8_ = local_de0._0_8_;
  local_dd0.z = local_de0.z;
  local_db0._0_8_ = local_dc0._0_8_;
  local_db0.z = local_dc0.z;
  local_da0 = local_125c;
  local_9a0 = local_a40;
  local_820._0_8_ = local_dc0._0_8_;
  local_820.z = local_dc0.z;
  local_810 = local_125c;
  local_800 = local_dc0.z;
  local_7f8 = local_125c;
  local_7e8 = local_125c;
  local_7d8 = local_125c;
  local_410._0_8_ = local_de0._0_8_;
  local_410.z = local_de0.z;
  local_400 = local_125c;
  local_3f0 = local_de0.z;
  amrex::Array4<double>::Array4(&local_1338,in_stack_00000090,&local_db0,&local_dd0,local_11bc);
  in_stack_00000090 = in_stack_00000090 + local_1338.nstride * local_1338.ncomp;
  local_df4 = local_11bc;
  local_78c = 0;
  local_7b8 = local_125c._0_4_;
  local_79c = 1;
  iStack_7b4 = local_125c._4_4_;
  local_e10.x = local_125c._0_4_;
  local_e10.y = local_125c._4_4_;
  local_7ac = 2;
  local_e10.z = local_125c._8_4_;
  local_378 = &iStack_1250;
  local_37c = 0;
  local_3a8 = iStack_1250 + 1;
  local_388 = &iStack_1250;
  local_38c = 1;
  iStack_3a4 = local_124c + 1;
  local_398 = &iStack_1250;
  local_39c = 2;
  local_e30.z = iStack_1248 + 1;
  local_e30.y = iStack_3a4;
  local_e30.x = local_3a8;
  local_e20._0_8_ = local_e30._0_8_;
  local_e20.z = local_e30.z;
  local_e00._0_8_ = local_e10._0_8_;
  local_e00.z = local_e10.z;
  local_df0 = local_125c;
  local_de8 = in_stack_00000090;
  local_d68 = &local_1338;
  local_7d0._0_8_ = local_e10._0_8_;
  local_7d0.z = local_e10.z;
  local_7c0 = local_125c;
  local_7b0 = local_e10.z;
  local_7a8 = local_125c;
  local_798 = local_125c;
  local_788 = local_125c;
  local_3c0._0_8_ = local_e30._0_8_;
  local_3c0.z = local_e30.z;
  local_3b0 = local_125c;
  local_3a0 = local_e30.z;
  amrex::Array4<double>::Array4(&local_1378,in_stack_00000090,&local_e00,&local_e20,local_11bc);
  in_stack_00000090 = in_stack_00000090 + local_1378.nstride * local_1378.ncomp;
  local_e44 = local_11bc;
  local_73c = 0;
  local_768 = local_1294.x;
  local_74c = 1;
  iStack_764 = local_1294.y;
  local_e60.x = local_1294.x;
  local_e60.y = local_1294.y;
  local_75c = 2;
  local_e60.z = local_1294.z;
  local_328 = &iStack_1288;
  local_32c = 0;
  local_358 = iStack_1288 + 1;
  local_338 = &iStack_1288;
  local_33c = 1;
  iStack_354 = local_1284 + 1;
  local_348 = &iStack_1288;
  local_34c = 2;
  local_e80.z = iStack_1280 + 1;
  local_e80.y = iStack_354;
  local_e80.x = local_358;
  local_e70._0_8_ = local_e80._0_8_;
  local_e70.z = local_e80.z;
  local_e50._0_8_ = local_e60._0_8_;
  local_e50.z = local_e60.z;
  local_e40 = &local_1294;
  local_e38 = in_stack_00000090;
  local_d70 = &local_1378;
  local_780._0_8_ = local_e60._0_8_;
  local_780.z = local_e60.z;
  local_770 = &local_1294;
  local_760 = local_e60.z;
  local_758 = &local_1294;
  local_748 = &local_1294;
  local_738 = &local_1294;
  local_370._0_8_ = local_e80._0_8_;
  local_370.z = local_e80.z;
  local_360 = &local_1294;
  local_350 = local_e80.z;
  amrex::Array4<double>::Array4(&local_13b8,in_stack_00000090,&local_e50,&local_e70,local_11bc);
  in_stack_00000090 = in_stack_00000090 + local_13b8.nstride * local_13b8.ncomp;
  local_e94 = local_11bc;
  local_6ec = 0;
  local_718 = local_1294.x;
  local_6fc = 1;
  iStack_714 = local_1294.y;
  local_eb0.x = local_1294.x;
  local_eb0.y = local_1294.y;
  local_70c = 2;
  local_eb0.z = local_1294.z;
  local_2d8 = &iStack_1288;
  local_2dc = 0;
  local_308 = iStack_1288 + 1;
  local_2e8 = &iStack_1288;
  local_2ec = 1;
  iStack_304 = local_1284 + 1;
  local_2f8 = &iStack_1288;
  local_2fc = 2;
  local_ed0.z = iStack_1280 + 1;
  local_ed0.y = iStack_304;
  local_ed0.x = local_308;
  local_ec0._0_8_ = local_ed0._0_8_;
  local_ec0.z = local_ed0.z;
  local_ea0._0_8_ = local_eb0._0_8_;
  local_ea0.z = local_eb0.z;
  local_e90 = &local_1294;
  local_e88 = in_stack_00000090;
  local_d78 = &local_13b8;
  local_730._0_8_ = local_eb0._0_8_;
  local_730.z = local_eb0.z;
  local_720 = &local_1294;
  local_710 = local_eb0.z;
  local_708 = &local_1294;
  local_6f8 = &local_1294;
  local_6e8 = &local_1294;
  local_320._0_8_ = local_ed0._0_8_;
  local_320.z = local_ed0.z;
  local_310 = &local_1294;
  local_300 = local_ed0.z;
  amrex::Array4<double>::Array4(&local_13f8,in_stack_00000090,&local_ea0,&local_ec0,local_11bc);
  in_stack_00000090 = in_stack_00000090 + local_13f8.nstride * local_13f8.ncomp;
  f2 = (anon_class_560_13_b36ffc0b *)local_12d8;
  local_ee4 = local_11bc;
  local_69c = 0;
  local_6c8 = local_12d8._0_4_;
  local_6ac = 1;
  uStack_6c4 = local_12d8._4_4_;
  local_f00 = (BCRec *)local_12d8._0_8_;
  local_6bc = 2;
  local_ef8 = local_12d8._8_4_;
  local_288 = local_12d8 + 0xc;
  local_28c = 0;
  local_2b8 = local_12d8._12_4_ + 1;
  local_298 = local_12d8 + 0xc;
  local_29c = 1;
  iStack_2b4 = local_12d8._16_4_ + 1;
  local_2a8 = local_12d8 + 0xc;
  local_2ac = 2;
  local_f20.z = local_12d8._20_4_ + 1;
  local_f20.y = iStack_2b4;
  local_f20.x = local_2b8;
  local_f10._0_8_ = local_f20._0_8_;
  local_f10.z = local_f20.z;
  local_ef0 = local_f00;
  local_ee8 = local_ef8;
  local_ee0 = f2;
  local_ed8 = in_stack_00000090;
  local_d80 = &local_13f8;
  local_6e0 = local_f00;
  local_6d8 = local_ef8;
  local_6d0 = f2;
  local_6c0 = local_ef8;
  local_6b8 = f2;
  local_6a8 = f2;
  local_698 = f2;
  local_2d0._0_8_ = local_f20._0_8_;
  local_2d0.z = local_f20.z;
  local_2c0 = f2;
  local_2b0 = local_f20.z;
  amrex::Array4<double>::Array4
            (&local_1438,in_stack_00000090,(Dim3 *)&local_ef0,&local_f10,local_11bc);
  in_stack_00000090 = in_stack_00000090 + local_1438.nstride * local_1438.ncomp;
  local_f34 = local_11bc;
  local_64c = 0;
  local_678 = local_12d8._0_4_;
  local_65c = 1;
  uStack_674 = local_12d8._4_4_;
  local_f50 = (BCRec *)local_12d8._0_8_;
  local_66c = 2;
  local_f48 = local_12d8._8_4_;
  local_238 = local_12d8 + 0xc;
  local_23c = 0;
  local_268 = local_12d8._12_4_ + 1;
  local_248 = local_12d8 + 0xc;
  local_24c = 1;
  iStack_264 = local_12d8._16_4_ + 1;
  local_258 = local_12d8 + 0xc;
  local_25c = 2;
  local_f70.z = local_12d8._20_4_ + 1;
  local_f70.y = iStack_264;
  local_f70.x = local_268;
  local_f60._0_8_ = local_f70._0_8_;
  local_f60.z = local_f70.z;
  local_f40 = local_f50;
  local_f38 = local_f48;
  local_f30 = f2;
  local_f28 = in_stack_00000090;
  local_d88 = &local_1438;
  local_690 = local_f50;
  local_688 = local_f48;
  local_680 = f2;
  local_670 = local_f48;
  local_668 = f2;
  local_658 = f2;
  local_648 = f2;
  local_280._0_8_ = local_f70._0_8_;
  local_280.z = local_f70.z;
  local_270 = f2;
  local_260 = local_f70.z;
  amrex::Array4<double>::Array4
            (&local_1478,in_stack_00000090,(Dim3 *)&local_f40,&local_f60,local_11bc);
  in_stack_00000090 = in_stack_00000090 + local_1478.nstride * local_1478.ncomp;
  local_1668 = *in_stack_00000050;
  uStack_1660 = in_stack_00000050[1];
  local_1658 = in_stack_00000050[2];
  uStack_1650 = in_stack_00000050[3];
  uStack_1648 = in_stack_00000050[4];
  uStack_1634 = *(undefined8 *)((long)in_stack_00000050 + 0x34);
  uStack_1638 = (undefined4)((ulong)*(undefined8 *)((long)in_stack_00000050 + 0x2c) >> 0x20);
  uStack_1640 = (undefined4)in_stack_00000050[5];
  local_163c = (undefined4)((ulong)in_stack_00000050[5] >> 0x20);
  local_1628 = *in_stack_00000038;
  uStack_1620 = in_stack_00000038[1];
  local_1618 = in_stack_00000038[2];
  uStack_1610 = in_stack_00000038[3];
  uStack_1608 = in_stack_00000038[4];
  uStack_15f4 = *(undefined8 *)((long)in_stack_00000038 + 0x34);
  uStack_15f8 = (undefined4)((ulong)*(undefined8 *)((long)in_stack_00000038 + 0x2c) >> 0x20);
  uStack_1600 = (undefined4)in_stack_00000038[5];
  local_15fc = (undefined4)((ulong)in_stack_00000038[5] >> 0x20);
  local_15e8 = local_11e9 & 1;
  local_15e0 = local_11e8;
  local_15d8 = *in_stack_00000068;
  uStack_15d0 = in_stack_00000068[1];
  local_15c8 = in_stack_00000068[2];
  uStack_15c0 = in_stack_00000068[3];
  uStack_15b8 = in_stack_00000068[4];
  uStack_15a4 = *(undefined8 *)((long)in_stack_00000068 + 0x34);
  uStack_15a8 = (undefined4)((ulong)*(undefined8 *)((long)in_stack_00000068 + 0x2c) >> 0x20);
  uStack_15b0 = (undefined4)in_stack_00000068[5];
  local_15ac = (undefined4)((ulong)in_stack_00000068[5] >> 0x20);
  local_1598 = *in_stack_00000020;
  uStack_1590 = in_stack_00000020[1];
  local_1588 = in_stack_00000020[2];
  uStack_1580 = in_stack_00000020[3];
  uStack_1578 = in_stack_00000020[4];
  uStack_1564 = *(undefined8 *)((long)in_stack_00000020 + 0x34);
  uStack_1568 = (undefined4)((ulong)*(undefined8 *)((long)in_stack_00000020 + 0x2c) >> 0x20);
  uStack_1570 = (undefined4)in_stack_00000020[5];
  local_156c = (undefined4)((ulong)in_stack_00000020[5] >> 0x20);
  local_1550 = *in_stack_00000018;
  uStack_1548 = in_stack_00000018[1];
  local_1540 = in_stack_00000018[2];
  uStack_1538 = in_stack_00000018[3];
  uStack_1530 = in_stack_00000018[4];
  uStack_151c = *(undefined8 *)((long)in_stack_00000018 + 0x34);
  uStack_1520 = (undefined4)((ulong)*(undefined8 *)((long)in_stack_00000018 + 0x2c) >> 0x20);
  uStack_1528 = (undefined4)in_stack_00000018[5];
  local_1524 = (undefined4)((ulong)in_stack_00000018[5] >> 0x20);
  local_1508 = local_11f0;
  local_1510 = local_11f8;
  local_14fc = local_120c;
  local_1504 = local_1214;
  aDStack_14d8[1].z = local_1338.end.z;
  iStack_14c0 = local_1338.ncomp;
  aDStack_14d8[0].x = local_1338.begin.x;
  aDStack_14d8[0].y = local_1338.begin.y;
  local_14e8 = local_1338.kstride;
  lStack_14e0 = local_1338.nstride;
  local_14f8 = local_1338.p;
  LStack_14f0 = local_1338.jstride;
  aDStack_1498[1].z = local_1378.end.z;
  iStack_1480 = local_1378.ncomp;
  aDStack_1498[0].x = local_1378.begin.x;
  aDStack_1498[0].y = local_1378.begin.y;
  local_14a8 = local_1378.kstride;
  lStack_14a0 = local_1378.nstride;
  local_14b8 = local_1378.p;
  LStack_14b0 = local_1378.jstride;
  local_1858 = *in_stack_00000058;
  uStack_1850 = in_stack_00000058[1];
  local_1848 = in_stack_00000058[2];
  uStack_1840 = in_stack_00000058[3];
  uStack_1838 = in_stack_00000058[4];
  uStack_1824 = *(undefined8 *)((long)in_stack_00000058 + 0x34);
  uStack_1828 = (undefined4)((ulong)*(undefined8 *)((long)in_stack_00000058 + 0x2c) >> 0x20);
  uStack_1830 = (undefined4)in_stack_00000058[5];
  local_182c = (undefined4)((ulong)in_stack_00000058[5] >> 0x20);
  local_1818 = *in_stack_00000040;
  uStack_1810 = in_stack_00000040[1];
  local_1808 = in_stack_00000040[2];
  uStack_1800 = in_stack_00000040[3];
  uStack_17f8 = in_stack_00000040[4];
  uStack_17e4 = *(undefined8 *)((long)in_stack_00000040 + 0x34);
  uStack_17e8 = (undefined4)((ulong)*(undefined8 *)((long)in_stack_00000040 + 0x2c) >> 0x20);
  uStack_17f0 = (undefined4)in_stack_00000040[5];
  local_17ec = (undefined4)((ulong)in_stack_00000040[5] >> 0x20);
  local_17d8 = local_11e9 & 1;
  local_17d0 = local_11e8;
  local_17c8 = *in_stack_00000068;
  uStack_17c0 = in_stack_00000068[1];
  local_17b8 = in_stack_00000068[2];
  uStack_17b0 = in_stack_00000068[3];
  uStack_17a8 = in_stack_00000068[4];
  uStack_1794 = *(undefined8 *)((long)in_stack_00000068 + 0x34);
  uStack_1798 = (undefined4)((ulong)*(undefined8 *)((long)in_stack_00000068 + 0x2c) >> 0x20);
  uStack_17a0 = (undefined4)in_stack_00000068[5];
  local_179c = (undefined4)((ulong)in_stack_00000068[5] >> 0x20);
  local_1788 = *in_stack_00000028;
  uStack_1780 = in_stack_00000028[1];
  local_1778 = in_stack_00000028[2];
  uStack_1770 = in_stack_00000028[3];
  uStack_1768 = in_stack_00000028[4];
  uStack_1754 = *(undefined8 *)((long)in_stack_00000028 + 0x34);
  uStack_1758 = (undefined4)((ulong)*(undefined8 *)((long)in_stack_00000028 + 0x2c) >> 0x20);
  uStack_1760 = (undefined4)in_stack_00000028[5];
  local_175c = (undefined4)((ulong)in_stack_00000028[5] >> 0x20);
  local_1740 = *in_stack_00000018;
  uStack_1738 = in_stack_00000018[1];
  local_1730 = in_stack_00000018[2];
  uStack_1728 = in_stack_00000018[3];
  uStack_1720 = in_stack_00000018[4];
  uStack_170c = *(undefined8 *)((long)in_stack_00000018 + 0x34);
  uStack_1710 = (undefined4)((ulong)*(undefined8 *)((long)in_stack_00000018 + 0x2c) >> 0x20);
  uStack_1718 = (undefined4)in_stack_00000018[5];
  local_1714 = (undefined4)((ulong)in_stack_00000018[5] >> 0x20);
  local_16f8 = local_11f0;
  local_1700 = local_11f8;
  local_16ec = local_120c;
  local_16f4 = local_1214;
  aDStack_16c8[1].z = local_13b8.end.z;
  iStack_16b0 = local_13b8.ncomp;
  aDStack_16c8[0].x = local_13b8.begin.x;
  aDStack_16c8[0].y = local_13b8.begin.y;
  local_16d8 = local_13b8.kstride;
  lStack_16d0 = local_13b8.nstride;
  local_16e8 = local_13b8.p;
  LStack_16e0 = local_13b8.jstride;
  aDStack_1688[1].z = local_13f8.end.z;
  iStack_1670 = local_13f8.ncomp;
  aDStack_1688[0].x = local_13f8.begin.x;
  aDStack_1688[0].y = local_13f8.begin.y;
  local_1698 = local_13f8.kstride;
  lStack_1690 = local_13f8.nstride;
  local_16a8 = local_13f8.p;
  LStack_16a0 = local_13f8.jstride;
  local_1a48._0_8_ = *(undefined8 *)in_stack_00000060;
  local_1a48._8_4_ = in_stack_00000060[2];
  local_1a48._12_4_ = in_stack_00000060[3];
  local_1a48._16_8_ = *(undefined8 *)(in_stack_00000060 + 4);
  local_1a48._24_8_ = *(undefined8 *)(in_stack_00000060 + 6);
  uStack_1a28 = *(undefined8 *)(in_stack_00000060 + 8);
  uStack_1a14 = *(undefined8 *)(in_stack_00000060 + 0xd);
  uStack_1a18 = (undefined4)((ulong)*(undefined8 *)(in_stack_00000060 + 0xb) >> 0x20);
  uStack_1a20 = (undefined4)*(undefined8 *)(in_stack_00000060 + 10);
  local_1a1c = (undefined4)((ulong)*(undefined8 *)(in_stack_00000060 + 10) >> 0x20);
  local_1a08 = *in_stack_00000048;
  uStack_1a00 = in_stack_00000048[1];
  local_19f8 = in_stack_00000048[2];
  uStack_19f0 = in_stack_00000048[3];
  uStack_19e8 = in_stack_00000048[4];
  uStack_19d4 = *(undefined8 *)((long)in_stack_00000048 + 0x34);
  uStack_19d8 = (undefined4)((ulong)*(undefined8 *)((long)in_stack_00000048 + 0x2c) >> 0x20);
  uStack_19e0 = (undefined4)in_stack_00000048[5];
  local_19dc = (undefined4)((ulong)in_stack_00000048[5] >> 0x20);
  local_19c8 = local_11e9 & 1;
  local_19c0 = local_11e8;
  local_19b8 = *in_stack_00000068;
  uStack_19b0 = in_stack_00000068[1];
  local_19a8 = in_stack_00000068[2];
  uStack_19a0 = in_stack_00000068[3];
  uStack_1998 = in_stack_00000068[4];
  uStack_1984 = *(undefined8 *)((long)in_stack_00000068 + 0x34);
  uStack_1988 = (undefined4)((ulong)*(undefined8 *)((long)in_stack_00000068 + 0x2c) >> 0x20);
  uStack_1990 = (undefined4)in_stack_00000068[5];
  local_198c = (undefined4)((ulong)in_stack_00000068[5] >> 0x20);
  local_1978 = *in_stack_00000030;
  uStack_1970 = in_stack_00000030[1];
  local_1968 = in_stack_00000030[2];
  uStack_1960 = in_stack_00000030[3];
  uStack_1958 = in_stack_00000030[4];
  uStack_1944 = *(undefined8 *)((long)in_stack_00000030 + 0x34);
  uStack_1948 = (undefined4)((ulong)*(undefined8 *)((long)in_stack_00000030 + 0x2c) >> 0x20);
  uStack_1950 = (undefined4)in_stack_00000030[5];
  local_194c = (undefined4)((ulong)in_stack_00000030[5] >> 0x20);
  local_1930 = *in_stack_00000018;
  uStack_1928 = in_stack_00000018[1];
  local_1920 = in_stack_00000018[2];
  uStack_1918 = in_stack_00000018[3];
  uStack_1910 = in_stack_00000018[4];
  uStack_18fc = *(undefined8 *)((long)in_stack_00000018 + 0x34);
  uStack_1900 = (undefined4)((ulong)*(undefined8 *)((long)in_stack_00000018 + 0x2c) >> 0x20);
  uStack_1908 = (undefined4)in_stack_00000018[5];
  local_1904 = (undefined4)((ulong)in_stack_00000018[5] >> 0x20);
  local_18e8 = local_11f0;
  local_18f0 = local_11f8;
  local_18dc = local_120c;
  local_18e4 = local_1214;
  aDStack_18b8[1].z = local_1438.end.z;
  iStack_18a0 = local_1438.ncomp;
  aDStack_18b8[0].x = local_1438.begin.x;
  aDStack_18b8[0].y = local_1438.begin.y;
  local_18c8 = local_1438.kstride;
  lStack_18c0 = local_1438.nstride;
  local_18d8 = local_1438.p;
  LStack_18d0 = local_1438.jstride;
  aDStack_1878[1].z = local_1478.end.z;
  iStack_1860 = local_1478.ncomp;
  aDStack_1878[0].x = local_1478.begin.x;
  aDStack_1878[0].y = local_1478.begin.y;
  local_1888 = local_1478.kstride;
  lStack_1880 = local_1478.nstride;
  local_1898 = local_1478.p;
  LStack_1890 = local_1478.jstride;
  pBVar5 = (Box *)local_1a48;
  iVar8 = local_11bc;
  local_d90 = &local_1478;
  amrex::
  ParallelFor<int,int,int,Godunov::ExtrapVelToFacesOnBox(amrex::Box_const&,int,amrex::Box_const&,amrex::Box_const&,amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Box_const&,double_const*,double,amrex::BCRec_const*,bool,double*)::__0,Godunov::ExtrapVelToFacesOnBox(amrex::Box_const&,int,amrex::Box_const&,amrex::Box_const&,amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Box_const&,double_const*,double,amrex::BCRec_const*,bool,double*)::__1,Godunov::ExtrapVelToFacesOnBox(amrex::Box_const&,int,amrex::Box_const&,amrex::Box_const&,amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Box_const&,double_const*,double,amrex::BCRec_const*,bool,double*)::__2,void,void,void>
            (in_stack_ffffffffffffcb10,ncomp1,in_stack_ffffffffffffcb00,pBVar5,
             in_stack_ffffffffffffcaf4,(anon_class_496_12_1cb31a64 *)f2,in_stack_ffffffffffffcb20,
             in_stack_ffffffffffffcb28,(anon_class_496_12_ad935bc3 *)in_stack_ffffffffffffcb30);
  local_1a88 = *in_stack_00000038;
  uStack_1a80 = in_stack_00000038[1];
  local_1a78 = in_stack_00000038[2];
  uStack_1a70 = in_stack_00000038[3];
  local_1a68 = in_stack_00000038[4];
  uStack_1a60 = in_stack_00000038[5];
  local_1a58 = in_stack_00000038[6];
  uStack_1a50 = in_stack_00000038[7];
  local_1ac8 = *in_stack_00000040;
  uStack_1ac0 = in_stack_00000040[1];
  local_1ab8 = in_stack_00000040[2];
  uStack_1ab0 = in_stack_00000040[3];
  local_1aa8 = in_stack_00000040[4];
  uStack_1aa0 = in_stack_00000040[5];
  local_1a98 = in_stack_00000040[6];
  uStack_1a90 = in_stack_00000040[7];
  local_1b08 = *in_stack_00000048;
  uStack_1b00 = in_stack_00000048[1];
  local_1af8 = in_stack_00000048[2];
  uStack_1af0 = in_stack_00000048[3];
  local_1ae8 = in_stack_00000048[4];
  uStack_1ae0 = in_stack_00000048[5];
  local_1ad8 = in_stack_00000048[6];
  uStack_1ad0 = in_stack_00000048[7];
  a_p = (double *)*in_stack_00000050;
  local_11a8 = local_11b8;
  local_11ac = 1;
  local_1b68.smallend.vect._0_8_ = *local_11b8;
  local_1b68.bigend.vect[2] = ((int *)((long)local_11b8 + 0x14))[0];
  local_1b68.btype.itype = ((int *)((long)local_11b8 + 0x14))[1];
  local_1b68.bigend.vect[1] = (int)((ulong)*(undefined8 *)((long)local_11b8 + 0xc) >> 0x20);
  local_1b68.smallend.vect[2] = (int)local_11b8[1];
  local_1b68.bigend.vect[0] = (int)((ulong)local_11b8[1] >> 0x20);
  amrex::Box::grow(&local_1b68,1);
  local_f84 = 1;
  local_5fc = 0;
  local_628 = local_1b68.smallend.vect[0];
  local_60c = 1;
  iStack_624 = local_1b68.smallend.vect[1];
  local_fa0._0_4_ = local_1b68.smallend.vect[0];
  local_fa0._4_4_ = local_1b68.smallend.vect[1];
  local_61c = 2;
  local_f98 = local_1b68.smallend.vect[2];
  local_1e8 = &local_1b68.bigend;
  local_1ec = 0;
  local_218 = local_1b68.bigend.vect[0] + 1;
  local_1f8 = &local_1b68.bigend;
  local_1fc = 1;
  iStack_214 = local_1b68.bigend.vect[1] + 1;
  local_208 = &local_1b68.bigend;
  local_20c = 2;
  local_fc0.z = local_1b68.bigend.vect[2] + 1;
  local_fc0.y = iStack_214;
  local_fc0.x = local_218;
  local_fac._0_8_ = local_fc0._0_8_;
  local_fac.z = local_fc0.z;
  local_f90._0_8_ = local_fa0;
  local_f90.z = local_f98;
  local_f80 = &local_1b68;
  local_f78 = a_p;
  local_640 = local_fa0;
  local_638 = local_f98;
  local_630 = &local_1b68;
  local_620 = local_f98;
  local_618 = &local_1b68;
  local_608 = &local_1b68;
  local_5f8 = &local_1b68;
  local_230._0_8_ = local_fc0._0_8_;
  local_230.z = local_fc0.z;
  local_220 = &local_1b68;
  local_210 = local_fc0.z;
  amrex::Array4<double>::Array4(&local_1b48,a_p,&local_f90,&local_fac,1);
  amrex::Box::Box<double>((Box *)CONCAT44(in_stack_ffffffffffffcaf4,iVar8),(Array4<double> *)f2);
  memcpy(local_1bc8,&local_1b48,0x3c);
  amrex::
  ParallelFor<Godunov::ExtrapVelToFacesOnBox(amrex::Box_const&,int,amrex::Box_const&,amrex::Box_const&,amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Box_const&,double_const*,double,amrex::BCRec_const*,bool,double*)::__3>
            (in_stack_ffffffffffffcb38,(anon_class_64_1_898abb02 *)in_stack_ffffffffffffcb30);
  local_1c00.smallend.vect._0_8_ = *(undefined8 *)local_11c8;
  local_1c00.smallend.vect[2] = local_11c8[2];
  local_1c00.bigend.vect[0] = local_11c8[3];
  uVar2 = *(undefined8 *)(local_11c8 + 4);
  uVar1 = local_11c8[6];
  local_c80 = &local_1c00;
  for (local_c84 = 0; local_c84 < 3; local_c84 = local_c84 + 1) {
    local_a90 = &local_1c00.btype;
    local_a94 = local_c84;
    local_954 = local_c84;
    local_8d0 = local_c84;
    if ((uVar1 & 1 << ((byte)local_c84 & 0x1f)) != 0) {
      local_b50 = &local_1c00.bigend;
      local_b54 = local_c84;
      local_b58 = 0xffffffff;
      local_b50->vect[local_c84] = local_b50->vect[local_c84] + -1;
    }
    local_950 = local_a90;
  }
  local_838 = &local_1c00.btype;
  local_1c00.btype.itype = 0;
  local_1c00.bigend.vect._4_8_ = uVar2;
  pBVar6 = amrex::Box::grow(local_c80,0,1);
  local_1c5c._0_4_ = (pBVar6->smallend).vect[0];
  local_1c5c._4_4_ = (pBVar6->smallend).vect[1];
  local_1be4._8_8_ = *(undefined8 *)((pBVar6->smallend).vect + 2);
  local_1bd4 = *(undefined8 *)((pBVar6->bigend).vect + 1);
  local_1bcc = (pBVar6->btype).itype;
  local_fc8 = (double *)*in_stack_00000058;
  local_bd0 = local_1be4;
  local_bd4 = 1;
  local_bc0 = local_1c5c;
  local_bc4 = 1;
  local_af0 = &local_1c44;
  local_af4 = 1;
  local_8f4 = 1;
  local_8e8 = 1;
  local_1c44 = local_1bcc;
  if ((local_1bcc & 2) == 0) {
    local_bb0 = &iStack_1c50;
    local_bb4 = 1;
    local_bb8 = 1;
    local_a30 = &local_1c44;
    local_a34 = 1;
    local_898 = 1;
    local_1c44 = local_1bcc | 2;
  }
  local_fd0 = local_1c5c;
  local_fd4 = 1;
  local_5ac = 0;
  local_5d8 = local_1c5c._0_4_;
  local_5bc = 1;
  iStack_5d4 = local_1c5c._4_4_;
  local_5cc = 2;
  local_1c5c._8_4_ = (undefined4)local_1be4._8_8_;
  local_ff0.z = local_1c5c._8_4_;
  local_198 = &iStack_1c50;
  local_19c = 0;
  iStack_1c50 = (int)((ulong)local_1be4._8_8_ >> 0x20);
  local_1c8 = iStack_1c50 + 1;
  local_1a8 = &iStack_1c50;
  local_1ac = 1;
  local_1c4c._0_4_ = (int)local_1bd4;
  iStack_1c4 = (int)local_1c4c + 1;
  local_1b8 = &iStack_1c50;
  local_1bc = 2;
  local_1c4c._4_4_ = (int)((ulong)local_1bd4 >> 0x20);
  local_1010.z = local_1c4c._4_4_ + 1;
  local_1010.y = iStack_1c4;
  local_1010.x = local_1c8;
  unique0x10004272 = local_1be4._8_8_;
  local_1c4c = local_1bd4;
  local_1be4._0_8_ = local_1c5c._0_8_;
  local_ffc._0_8_ = local_1010._0_8_;
  local_ffc.z = local_1010.z;
  local_ff0._0_8_ = local_1c5c._0_8_;
  local_fe0._0_8_ = local_1c5c._0_8_;
  local_fe0.z = local_ff0.z;
  local_8f0 = local_af0;
  local_5f0._0_8_ = local_1c5c._0_8_;
  local_5f0.z = local_ff0.z;
  local_5e0 = local_fd0;
  local_5d0 = local_ff0.z;
  local_5c8 = local_fd0;
  local_5b8 = local_fd0;
  local_5a8 = local_fd0;
  local_1e0._0_8_ = local_1010._0_8_;
  local_1e0.z = local_1010.z;
  local_1d0 = local_fd0;
  local_1c0 = local_1010.z;
  amrex::Array4<double>::Array4(&local_1c40,local_fc8,&local_fe0,&local_ffc,1);
  local_1018 = *(double **)in_stack_00000060;
  local_bf0 = local_1be4;
  local_bf4 = 2;
  uVar2._0_4_ = local_1be4._0_4_;
  uVar2._4_4_ = local_1be4._4_4_;
  local_1ca4 = local_1bcc;
  local_be0 = local_1cbc;
  local_be4 = 2;
  local_ae0 = &local_1ca4;
  local_ae4 = 2;
  local_904 = 2;
  local_8e4 = 2;
  if ((local_1bcc & 4) == 0) {
    local_ba0 = &iStack_1cb0;
    local_ba4 = 2;
    local_ba8 = 1;
    local_a20 = &local_1ca4;
    local_a24 = 2;
    local_89c = 2;
    local_1ca4 = local_1bcc | 4;
  }
  local_1020 = local_1cbc;
  local_1024 = 1;
  local_55c = 0;
  local_1cbc._0_4_ = (undefined4)local_1be4._0_8_;
  local_588 = local_1cbc._0_4_;
  local_56c = 1;
  local_1cbc._4_4_ = SUB84(local_1be4._0_8_,4);
  iStack_584 = local_1cbc._4_4_;
  local_1040.x = local_1be4._0_4_;
  local_1040.y = local_1be4._4_4_;
  local_57c = 2;
  local_1cbc._8_4_ = (undefined4)local_1be4._8_8_;
  local_1040.z = local_1cbc._8_4_;
  local_148 = &iStack_1cb0;
  local_14c = 0;
  iStack_1cb0 = SUB84(local_1be4._8_8_,4);
  local_178 = iStack_1cb0 + 1;
  local_158 = &iStack_1cb0;
  local_15c = 1;
  local_1cac._0_4_ = (int)local_1bd4;
  iStack_174 = (int)local_1cac + 1;
  local_168 = &iStack_1cb0;
  local_16c = 2;
  local_1cac._4_4_ = (int)((ulong)local_1bd4 >> 0x20);
  local_1060.z = local_1cac._4_4_ + 1;
  local_1060.y = iStack_174;
  local_1060.x = local_178;
  local_1cbc._0_8_ = uVar2;
  unique0x10004262 = local_1be4._8_8_;
  local_1cac = local_1bd4;
  local_104c._0_8_ = local_1060._0_8_;
  local_104c.z = local_1060.z;
  local_1030._0_8_ = local_1040._0_8_;
  local_1030.z = local_1040.z;
  local_900 = local_ae0;
  local_5a0._0_8_ = local_1040._0_8_;
  local_5a0.z = local_1040.z;
  local_590 = local_1020;
  local_580 = local_1040.z;
  local_578 = local_1020;
  local_568 = local_1020;
  local_558 = local_1020;
  local_190._0_8_ = local_1060._0_8_;
  local_190.z = local_1060.z;
  local_180 = local_1020;
  local_170 = local_1060.z;
  amrex::Array4<double>::Array4(&local_1ca0,local_1018,&local_1030,&local_104c,1);
  amrex::Box::Box<double>((Box *)CONCAT44(in_stack_ffffffffffffcaf4,iVar8),(Array4<double> *)f2);
  amrex::Box::Box<double>((Box *)CONCAT44(in_stack_ffffffffffffcaf4,iVar8),(Array4<double> *)f2);
  local_1f20 = local_11e8;
  local_1f18 = local_1238;
  memcpy(auStack_1f10,&local_1438,0x3c);
  memcpy(auStack_1ed0,&local_1478,0x3c);
  memcpy(auStack_1e90,in_stack_00000018,0x3c);
  memcpy(auStack_1e50,&local_1b48,0x3c);
  memcpy(auStack_1e10,in_stack_00000028,0x3c);
  memcpy(auStack_1dd0,&local_1ac8,0x3c);
  memcpy(auStack_1d90,in_stack_00000030,0x3c);
  local_1d50 = local_11f8;
  local_1d48 = local_11f0;
  local_1d44 = local_1214;
  local_1d3c = local_120c;
  memcpy(auStack_1d38,&local_1ca0,0x3c);
  local_2150 = local_11e8;
  local_2148 = local_1240;
  memcpy(auStack_2140,&local_13b8,0x3c);
  memcpy(auStack_2100,&local_13f8,0x3c);
  memcpy(auStack_20c0,in_stack_00000018,0x3c);
  memcpy(auStack_2080,&local_1b48,0x3c);
  memcpy(auStack_2040,in_stack_00000030,0x3c);
  memcpy(auStack_2000,&local_1b08,0x3c);
  memcpy(auStack_1fc0,in_stack_00000028,0x3c);
  local_1f80 = local_11f8;
  local_1f78 = local_11f0;
  local_1f74 = local_1214;
  local_1f6c = local_120c;
  memcpy(auStack_1f68,&local_1c40,0x3c);
  amrex::
  ParallelFor<Godunov::ExtrapVelToFacesOnBox(amrex::Box_const&,int,amrex::Box_const&,amrex::Box_const&,amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Box_const&,double_const*,double,amrex::BCRec_const*,bool,double*)::__4,Godunov::ExtrapVelToFacesOnBox(amrex::Box_const&,int,amrex::Box_const&,amrex::Box_const&,amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Box_const&,double_const*,double,amrex::BCRec_const*,bool,double*)::__5>
            ((Box *)in_stack_ffffffffffffcb00,pBVar5,
             (anon_class_560_13_425a984f *)CONCAT44(in_stack_ffffffffffffcaf4,iVar8),
             (anon_class_560_13_2e4b2513 *)f2);
  memcpy(auStack_23d0,&local_1338,0x3c);
  local_2390 = local_11e8;
  local_2388 = local_1238;
  memcpy(auStack_2380,in_stack_00000028,0x3c);
  memcpy(auStack_2340,&local_1c40,0x3c);
  local_2300 = local_1240;
  memcpy(auStack_22f8,in_stack_00000030,0x3c);
  memcpy(auStack_22b8,&local_1ca0,0x3c);
  memcpy(auStack_2278,&local_1378,0x3c);
  local_2238 = local_11e9 & 1;
  memcpy(auStack_2230,in_stack_00000068,0x3c);
  memcpy(auStack_21f0,in_stack_00000018,0x3c);
  local_21b0 = local_11f8;
  local_21a8 = local_11f0;
  local_21a4 = local_1214;
  local_219c = local_120c;
  memcpy(auStack_2198,local_11e0,0x3c);
  amrex::
  ParallelFor<Godunov::ExtrapVelToFacesOnBox(amrex::Box_const&,int,amrex::Box_const&,amrex::Box_const&,amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Box_const&,double_const*,double,amrex::BCRec_const*,bool,double*)::__6>
            (in_stack_ffffffffffffcb38,in_stack_ffffffffffffcb30);
  local_2410 = local_11d0->pbc;
  local_2408 = (local_11d0->ylo).p;
  LVar3 = (local_11d0->ylo).jstride;
  LVar4 = (local_11d0->ylo).kstride;
  local_c90 = (Box *)&local_2410;
  for (local_c94 = 0; local_c94 < 3; local_c94 = local_c94 + 1) {
    local_a80 = &local_23f8;
    local_a84 = local_c94;
    local_964 = local_c94;
    local_8cc = local_c94;
    if (((uint)LVar4 & 1 << ((byte)local_c94 & 0x1f)) != 0) {
      local_b40 = (long)&local_2408 + 4;
      local_b44 = local_c94;
      local_b48 = 0xffffffff;
      *(int *)(local_b40 + (long)local_c94 * 4) = *(int *)(local_b40 + (long)local_c94 * 4) + -1;
    }
    local_960 = local_a80;
  }
  local_830 = &local_23f8;
  local_23f8.itype = 0;
  local_2400 = LVar3;
  pBVar6 = amrex::Box::grow(local_c90,1,1);
  local_23f4 = *(Long *)(pBVar6->smallend).vect;
  local_23ec = *(undefined8 *)((pBVar6->smallend).vect + 2);
  local_23e4 = *(undefined8 *)((pBVar6->bigend).vect + 1);
  local_23dc = (pBVar6->btype).itype;
  local_1068 = (double *)*in_stack_00000058;
  local_c10 = &local_23f4;
  local_c14 = 0;
  local_c00 = &local_246c;
  local_c04 = 0;
  local_ad0 = &local_2454;
  local_ad4 = 0;
  local_914 = 0;
  local_8e0 = 0;
  local_2454 = local_23dc;
  if ((local_23dc & 1) == 0) {
    local_b90 = (long)&local_2464 + 4;
    local_b94 = 0;
    local_b98 = 1;
    local_a10 = &local_2454;
    local_a14 = 0;
    local_8a0 = 0;
    local_2454 = local_23dc | 1;
  }
  local_1070 = &local_246c;
  local_1074 = 1;
  local_50c = 0;
  local_246c._0_4_ = (undefined4)local_23f4;
  local_538 = (undefined4)local_246c;
  local_51c = 1;
  local_246c._4_4_ = (undefined4)((ulong)local_23f4 >> 0x20);
  uStack_534 = local_246c._4_4_;
  local_52c = 2;
  local_2464._0_4_ = (int)local_23ec;
  local_1088 = (int)local_2464;
  local_f8 = (long)&local_2464 + 4;
  local_fc = 0;
  local_2464._4_4_ = (int)((ulong)local_23ec >> 0x20);
  local_128 = local_2464._4_4_ + 1;
  local_108 = (long)&local_2464 + 4;
  local_10c = 1;
  local_245c._0_4_ = (int)local_23e4;
  iStack_124 = (int)local_245c + 1;
  local_118 = (long)&local_2464 + 4;
  local_11c = 2;
  local_245c._4_4_ = (int)((ulong)local_23e4 >> 0x20);
  local_10b0.z = local_245c._4_4_ + 1;
  local_10b0.y = iStack_124;
  local_10b0.x = local_128;
  local_246c = local_23f4;
  local_2464 = local_23ec;
  local_245c = local_23e4;
  local_109c._0_8_ = local_10b0._0_8_;
  local_109c.z = local_10b0.z;
  local_1090 = local_23f4;
  local_1080._0_8_ = local_23f4;
  local_1080.z = local_1088;
  local_910 = local_ad0;
  local_550 = local_23f4;
  local_548 = local_1088;
  local_540 = local_1070;
  local_530 = local_1088;
  local_528 = local_1070;
  local_518 = local_1070;
  local_508 = local_1070;
  local_140._0_8_ = local_10b0._0_8_;
  local_140.z = local_10b0.z;
  local_130 = local_1070;
  local_120 = local_10b0.z;
  amrex::Array4<double>::Array4(&local_2450,local_1068,&local_1080,&local_109c,1);
  local_10b8 = *(double **)in_stack_00000060;
  local_c30 = &local_23f4;
  local_c34 = 2;
  local_24b4 = local_23dc;
  local_c20 = &local_24cc;
  local_c24 = 2;
  local_ac0 = &local_24b4;
  local_ac4 = 2;
  local_924 = 2;
  local_8dc = 2;
  if ((local_23dc & 4) == 0) {
    local_b80 = (long)&local_24c4 + 4;
    local_b84 = 2;
    local_b88 = 1;
    local_a00 = &local_24b4;
    local_a04 = 2;
    local_8a4 = 2;
    local_24b4 = local_23dc | 4;
  }
  local_10c0 = &local_24cc;
  local_10c4 = 1;
  local_4bc = 0;
  local_24cc._0_4_ = (undefined4)local_23f4;
  local_4e8 = (undefined4)local_24cc;
  local_4cc = 1;
  local_24cc._4_4_ = (undefined4)((ulong)local_23f4 >> 0x20);
  uStack_4e4 = local_24cc._4_4_;
  local_10e0 = local_23f4;
  local_4dc = 2;
  local_24c4._0_4_ = (int)local_23ec;
  local_10d8 = (int)local_24c4;
  local_a8 = (long)&local_24c4 + 4;
  local_ac = 0;
  local_24c4._4_4_ = (int)((ulong)local_23ec >> 0x20);
  local_d8 = local_24c4._4_4_ + 1;
  local_b8 = (long)&local_24c4 + 4;
  local_bc = 1;
  local_24bc._0_4_ = (int)local_23e4;
  iStack_d4 = (int)local_24bc + 1;
  local_c8 = (long)&local_24c4 + 4;
  local_cc = 2;
  local_24bc._4_4_ = (int)((ulong)local_23e4 >> 0x20);
  local_1100.z = local_24bc._4_4_ + 1;
  local_1100.y = iStack_d4;
  local_1100.x = local_d8;
  local_24cc = local_23f4;
  local_24c4 = local_23ec;
  local_24bc = local_23e4;
  local_10ec._0_8_ = local_1100._0_8_;
  local_10ec.z = local_1100.z;
  local_10d0._0_8_ = local_10e0;
  local_10d0.z = local_10d8;
  local_920 = local_ac0;
  local_500 = local_10e0;
  local_4f8 = local_10d8;
  local_4f0 = local_10c0;
  local_4e0 = local_10d8;
  local_4d8 = local_10c0;
  local_4c8 = local_10c0;
  local_4b8 = local_10c0;
  local_f0._0_8_ = local_1100._0_8_;
  local_f0.z = local_1100.z;
  local_e0 = local_10c0;
  local_d0 = local_1100.z;
  amrex::Array4<double>::Array4(&local_24b0,local_10b8,&local_10d0,&local_10ec,1);
  amrex::Box::Box<double>((Box *)CONCAT44(in_stack_ffffffffffffcaf4,iVar8),(Array4<double> *)f2);
  amrex::Box::Box<double>((Box *)CONCAT44(in_stack_ffffffffffffcaf4,iVar8),(Array4<double> *)f2);
  local_2730 = local_11e8;
  local_2728 = local_1240;
  memcpy(auStack_2720,&local_1338,0x3c);
  memcpy(auStack_26e0,&local_1378,0x3c);
  memcpy(auStack_26a0,in_stack_00000018,0x3c);
  memcpy(auStack_2660,&local_1b48,0x3c);
  memcpy(auStack_2620,in_stack_00000030,0x3c);
  memcpy(auStack_25e0,&local_1b08,0x3c);
  memcpy(auStack_25a0,in_stack_00000020,0x3c);
  local_2560 = local_11f8;
  local_2558 = local_11f0;
  local_2554 = local_1214;
  local_254c = local_120c;
  memcpy(auStack_2548,&local_2450,0x3c);
  local_2960 = local_11e8;
  local_2958 = local_1230;
  memcpy(auStack_2950,&local_1438,0x3c);
  memcpy(auStack_2910,&local_1478,0x3c);
  memcpy(auStack_28d0,in_stack_00000018,0x3c);
  memcpy(auStack_2890,&local_1b48,0x3c);
  memcpy(auStack_2850,in_stack_00000020,0x3c);
  memcpy(auStack_2810,&local_1a88,0x3c);
  memcpy(auStack_27d0,in_stack_00000030,0x3c);
  local_2790 = local_11f8;
  local_2788 = local_11f0;
  local_2784 = local_1214;
  local_277c = local_120c;
  memcpy(auStack_2778,&local_24b0,0x3c);
  amrex::
  ParallelFor<Godunov::ExtrapVelToFacesOnBox(amrex::Box_const&,int,amrex::Box_const&,amrex::Box_const&,amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Box_const&,double_const*,double,amrex::BCRec_const*,bool,double*)::__7,Godunov::ExtrapVelToFacesOnBox(amrex::Box_const&,int,amrex::Box_const&,amrex::Box_const&,amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Box_const&,double_const*,double,amrex::BCRec_const*,bool,double*)::__8>
            ((Box *)in_stack_ffffffffffffcb00,pBVar5,
             (anon_class_560_13_5cce1d53 *)CONCAT44(in_stack_ffffffffffffcaf4,iVar8),
             (anon_class_560_13_84ed03cb *)f2);
  f_00 = local_11d0;
  memcpy(auStack_2be0,&local_13b8,0x3c);
  local_2ba0 = local_11e8;
  local_2b98 = local_1230;
  memcpy(auStack_2b90,in_stack_00000020,0x3c);
  memcpy(auStack_2b50,&local_2450,0x3c);
  local_2b10 = local_1240;
  memcpy(auStack_2b08,in_stack_00000030,0x3c);
  memcpy(auStack_2ac8,&local_24b0,0x3c);
  memcpy(auStack_2a88,&local_13f8,0x3c);
  local_2a48 = local_11e9 & 1;
  memcpy(auStack_2a40,in_stack_00000068,0x3c);
  memcpy(auStack_2a00,in_stack_00000018,0x3c);
  local_29c0 = local_11f8;
  local_29b8 = local_11f0;
  local_29b4 = local_1214;
  local_29ac = local_120c;
  memcpy(auStack_29a8,in_stack_00000008,0x3c);
  amrex::
  ParallelFor<Godunov::ExtrapVelToFacesOnBox(amrex::Box_const&,int,amrex::Box_const&,amrex::Box_const&,amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Box_const&,double_const*,double,amrex::BCRec_const*,bool,double*)::__9>
            (in_stack_ffffffffffffcb38,f_00);
  local_2c20.smallend.vect._0_8_ = *(undefined8 *)local_11d8;
  local_2c20.smallend.vect[2] = local_11d8[2];
  local_2c20.bigend.vect[0] = local_11d8[3];
  uVar2 = *(undefined8 *)(local_11d8 + 4);
  uVar1 = local_11d8[6];
  pBVar6 = &local_2c20;
  for (local_ca4 = 0; local_ca4 < 3; local_ca4 = local_ca4 + 1) {
    local_a70 = &local_2c20.btype;
    local_a74 = local_ca4;
    local_974 = local_ca4;
    local_8c8 = local_ca4;
    if ((uVar1 & 1 << ((byte)local_ca4 & 0x1f)) != 0) {
      local_b30 = &local_2c20.bigend;
      local_b34 = local_ca4;
      local_b38 = 0xffffffff;
      local_b30->vect[local_ca4] = local_b30->vect[local_ca4] + -1;
    }
    local_970 = local_a70;
  }
  local_828 = &local_2c20.btype;
  local_2c20.btype.itype = 0;
  local_2c20.bigend.vect._4_8_ = uVar2;
  local_ca0 = pBVar6;
  pBVar7 = amrex::Box::grow(pBVar6,2,1);
  local_2c04 = *(double **)(pBVar7->smallend).vect;
  local_2bfc = *(undefined8 *)((pBVar7->smallend).vect + 2);
  local_2bf4 = *(undefined8 *)((pBVar7->bigend).vect + 1);
  local_2bec = (pBVar7->btype).itype;
  local_1108 = (double *)*in_stack_00000058;
  local_c50 = &local_2c04;
  local_c54 = 0;
  local_c40 = &local_2c7c;
  local_c44 = 0;
  local_ab0 = &local_2c64;
  local_ab4 = 0;
  local_934 = 0;
  local_8d8 = 0;
  local_2c64 = local_2bec;
  if ((local_2bec & 1) == 0) {
    local_b70 = (long)&local_2c74 + 4;
    local_b74 = 0;
    local_b78 = 1;
    local_9f0 = &local_2c64;
    local_9f4 = 0;
    local_8a8 = 0;
    local_2c64 = local_2bec | 1;
  }
  local_1110 = &local_2c7c;
  local_1114 = 1;
  local_46c = 0;
  local_2c7c._0_4_ = SUB84(local_2c04,0);
  local_498 = (undefined4)local_2c7c;
  local_47c = 1;
  local_2c7c._4_4_ = (undefined4)((ulong)local_2c04 >> 0x20);
  uStack_494 = local_2c7c._4_4_;
  local_48c = 2;
  local_2c74._0_4_ = (int)local_2bfc;
  local_1128 = (int)local_2c74;
  local_58 = (long)&local_2c74 + 4;
  local_5c = 0;
  local_2c74._4_4_ = (int)((ulong)local_2bfc >> 0x20);
  local_88 = local_2c74._4_4_ + 1;
  local_68 = (long)&local_2c74 + 4;
  local_6c = 1;
  local_2c6c._0_4_ = (int)local_2bf4;
  iStack_84 = (int)local_2c6c + 1;
  local_78 = (long)&local_2c74 + 4;
  local_7c = 2;
  local_2c6c._4_4_ = (int)((ulong)local_2bf4 >> 0x20);
  local_1150.z = local_2c6c._4_4_ + 1;
  local_1150.y = iStack_84;
  local_1150.x = local_88;
  local_2c7c = local_2c04;
  local_2c74 = local_2bfc;
  local_2c6c = local_2bf4;
  local_113c._0_8_ = local_1150._0_8_;
  local_113c.z = local_1150.z;
  local_1130 = local_2c04;
  local_1120 = local_2c04;
  local_1118 = local_1128;
  local_930 = local_ab0;
  local_4b0 = local_2c04;
  local_4a8 = local_1128;
  local_4a0 = local_1110;
  local_490 = local_1128;
  local_488 = local_1110;
  local_478 = local_1110;
  local_468 = local_1110;
  local_a0._0_8_ = local_1150._0_8_;
  local_a0.z = local_1150.z;
  local_90 = local_1110;
  local_80 = local_1150.z;
  amrex::Array4<double>::Array4(&local_2c60,local_1108,(Dim3 *)&local_1120,&local_113c,1);
  local_1158 = *(double **)in_stack_00000060;
  local_c70 = &local_2c04;
  local_c74 = 1;
  local_2cc4 = local_2bec;
  local_c60 = &local_2cdc;
  local_c64 = 1;
  local_aa0 = &local_2cc4;
  local_aa4 = 1;
  local_944 = 1;
  local_8d4 = 1;
  if ((local_2bec & 2) == 0) {
    local_b60 = (long)&local_2cd4 + 4;
    local_b64 = 1;
    local_b68 = 1;
    local_9e0 = &local_2cc4;
    local_9e4 = 1;
    local_8ac = 1;
    local_2cc4 = local_2bec | 2;
  }
  local_1160 = &local_2cdc;
  local_1164 = 1;
  local_41c = 0;
  local_2cdc._0_4_ = SUB84(local_2c04,0);
  local_448 = (undefined4)local_2cdc;
  local_42c = 1;
  local_2cdc._4_4_ = (undefined4)((ulong)local_2c04 >> 0x20);
  uStack_444 = local_2cdc._4_4_;
  local_1180 = local_2c04;
  local_43c = 2;
  local_2cd4._0_4_ = (int)local_2bfc;
  local_1178 = (int)local_2cd4;
  local_8 = (long)&local_2cd4 + 4;
  local_c = 0;
  local_2cd4._4_4_ = (int)((ulong)local_2bfc >> 0x20);
  local_38 = local_2cd4._4_4_ + 1;
  local_18 = (long)&local_2cd4 + 4;
  local_1c = 1;
  local_2ccc._0_4_ = (int)local_2bf4;
  iStack_34 = (int)local_2ccc + 1;
  local_28 = (long)&local_2cd4 + 4;
  local_2c = 2;
  local_2ccc._4_4_ = (int)((ulong)local_2bf4 >> 0x20);
  local_11a0.z = local_2ccc._4_4_ + 1;
  local_11a0.y = iStack_34;
  local_11a0.x = local_38;
  local_2cdc = local_2c04;
  local_2cd4 = local_2bfc;
  local_2ccc = local_2bf4;
  local_118c._0_8_ = local_11a0._0_8_;
  local_118c.z = local_11a0.z;
  local_1170 = local_1180;
  local_1168 = local_1178;
  local_940 = local_aa0;
  local_460 = local_1180;
  local_458 = local_1178;
  local_450 = local_1160;
  local_440 = local_1178;
  local_438 = local_1160;
  local_428 = local_1160;
  local_418 = local_1160;
  local_50._0_8_ = local_11a0._0_8_;
  local_50.z = local_11a0.z;
  local_40 = local_1160;
  local_30 = local_11a0.z;
  amrex::Array4<double>::Array4(&local_2cc0,local_1158,(Dim3 *)&local_1170,&local_118c,1);
  amrex::Box::Box<double>((Box *)CONCAT44(in_stack_ffffffffffffcaf4,iVar8),(Array4<double> *)f2);
  amrex::Box::Box<double>((Box *)CONCAT44(in_stack_ffffffffffffcaf4,iVar8),(Array4<double> *)f2);
  local_2f40 = local_11e8;
  local_2f38 = local_1238;
  memcpy(auStack_2f30,&local_1338,0x3c);
  memcpy(auStack_2ef0,&local_1378,0x3c);
  memcpy(auStack_2eb0,in_stack_00000018,0x3c);
  memcpy(auStack_2e70,&local_1b48,0x3c);
  memcpy(auStack_2e30,in_stack_00000028,0x3c);
  memcpy(auStack_2df0,&local_1ac8,0x3c);
  memcpy(auStack_2db0,in_stack_00000020,0x3c);
  local_2d70 = local_11f8;
  local_2d68 = local_11f0;
  local_2d64 = local_1214;
  local_2d5c = local_120c;
  memcpy(auStack_2d58,&local_2c60,0x3c);
  local_3170 = local_11e8;
  local_3168 = local_1230;
  memcpy(auStack_3160,&local_13b8,0x3c);
  memcpy(auStack_3120,&local_13f8,0x3c);
  memcpy(auStack_30e0,in_stack_00000018,0x3c);
  memcpy(auStack_30a0,&local_1b48,0x3c);
  memcpy(auStack_3060,in_stack_00000020,0x3c);
  memcpy(auStack_3020,&local_1a88,0x3c);
  memcpy(auStack_2fe0,in_stack_00000028,0x3c);
  local_2fa0 = local_11f8;
  local_2f98 = local_11f0;
  local_2f94 = local_1214;
  local_2f8c = local_120c;
  memcpy(auStack_2f88,&local_2cc0,0x3c);
  amrex::
  ParallelFor<Godunov::ExtrapVelToFacesOnBox(amrex::Box_const&,int,amrex::Box_const&,amrex::Box_const&,amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Box_const&,double_const*,double,amrex::BCRec_const*,bool,double*)::__10,Godunov::ExtrapVelToFacesOnBox(amrex::Box_const&,int,amrex::Box_const&,amrex::Box_const&,amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Box_const&,double_const*,double,amrex::BCRec_const*,bool,double*)::__11>
            ((Box *)in_stack_ffffffffffffcb00,pBVar5,
             (anon_class_560_13_9f6088cf *)CONCAT44(in_stack_ffffffffffffcaf4,iVar8),f2);
  memcpy(auStack_33f0,&local_1438,0x3c);
  local_33b0 = local_11e8;
  local_33a8 = local_1230;
  memcpy(auStack_33a0,in_stack_00000020,0x3c);
  memcpy(auStack_3360,&local_2c60,0x3c);
  local_3320 = local_1238;
  memcpy(auStack_3318,in_stack_00000028,0x3c);
  memcpy(auStack_32d8,&local_2cc0,0x3c);
  memcpy(auStack_3298,&local_1478,0x3c);
  local_3258 = local_11e9 & 1;
  memcpy(auStack_3250,in_stack_00000068,0x3c);
  memcpy(auStack_3210,in_stack_00000018,0x3c);
  local_31d0 = local_11f8;
  local_31c8 = local_11f0;
  local_31c4 = local_1214;
  local_31bc = local_120c;
  memcpy(auStack_31b8,in_stack_00000010,0x3c);
  amrex::
  ParallelFor<Godunov::ExtrapVelToFacesOnBox(amrex::Box_const&,int,amrex::Box_const&,amrex::Box_const&,amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Box_const&,double_const*,double,amrex::BCRec_const*,bool,double*)::__12>
            (pBVar6,(anon_class_640_16_c676c2fe *)f_00);
  return;
}

Assistant:

void
Godunov::ExtrapVelToFacesOnBox ( Box const& bx, int ncomp,
                                 Box const& xbx,
                                 Box const& ybx,
                                 Box const& zbx,
                                 Array4<Real> const& qx,
                                 Array4<Real> const& qy,
                                 Array4<Real> const& qz,
                                 Array4<Real const> const& q,
                                 Array4<Real const> const& u_ad,
                                 Array4<Real const> const& v_ad,
                                 Array4<Real const> const& w_ad,
                                 Array4<Real> const& Imx,
                                 Array4<Real> const& Imy,
                                 Array4<Real> const& Imz,
                                 Array4<Real> const& Ipx,
                                 Array4<Real> const& Ipy,
                                 Array4<Real> const& Ipz,
                                 Array4<Real const> const& f,
                                 const Box& domain,
                                 const Real* dx_arr,
                                 Real l_dt,
                                 BCRec  const* pbc,
                                 bool l_use_forces_in_trans,
                                 Real* p)
{

    const Dim3 dlo = amrex::lbound(domain);
    const Dim3 dhi = amrex::ubound(domain);

    Real dx = dx_arr[0];
    Real dy = dx_arr[1];
    Real dz = dx_arr[2];

    Box xebox = Box(bx).grow(1,1).grow(2,1).surroundingNodes(0);
    Box yebox = Box(bx).grow(0,1).grow(2,1).surroundingNodes(1);
    Box zebox = Box(bx).grow(0,1).grow(1,1).surroundingNodes(2);

    Array4<Real> xlo = makeArray4(p, xebox, ncomp);
    p += xlo.size();
    Array4<Real> xhi = makeArray4(p, xebox, ncomp);
    p += xhi.size();
    Array4<Real> ylo = makeArray4(p, yebox, ncomp);
    p += ylo.size();
    Array4<Real> yhi = makeArray4(p, yebox, ncomp);
    p += yhi.size();
    Array4<Real> zlo = makeArray4(p, zebox, ncomp);
    p += zlo.size();
    Array4<Real> zhi = makeArray4(p, zebox, ncomp);
    p += zhi.size();

    amrex::ParallelFor(
    xebox, ncomp, [=] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
    {
        Real lo = Ipx(i-1,j,k,n);
        Real hi = Imx(i  ,j,k,n);

        if (l_use_forces_in_trans)
        {
            lo += 0.5*l_dt*f(i-1,j,k,n);
            hi += 0.5*l_dt*f(i  ,j,k,n);
        }

        Real uad = u_ad(i,j,k);
        auto bc = pbc[n];

        GodunovTransBC::SetTransTermXBCs(i, j, k, n, q, lo, hi, bc.lo(0), bc.hi(0), dlo.x, dhi.x, true);

        xlo(i,j,k,n) = lo;
        xhi(i,j,k,n) = hi;

        Real st = (uad >= 0.) ? lo : hi;
        Real fu = (amrex::Math::abs(uad) < small_vel) ? 0.0 : 1.0;
        Imx(i, j, k, n) = fu*st + (1.0 - fu) *0.5 * (hi + lo); // store xedge
    },
    yebox, ncomp, [=] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
    {
        Real lo = Ipy(i,j-1,k,n);
        Real hi = Imy(i,j  ,k,n);

        if (l_use_forces_in_trans)
        {
            lo += 0.5*l_dt*f(i,j-1,k,n);
            hi += 0.5*l_dt*f(i,j  ,k,n);
        }

        Real vad = v_ad(i,j,k);
        auto bc = pbc[n];

        GodunovTransBC::SetTransTermYBCs(i, j, k, n, q, lo, hi, bc.lo(1), bc.hi(1), dlo.y, dhi.y, true);

        ylo(i,j,k,n) = lo;
        yhi(i,j,k,n) = hi;

        Real st = (vad >= 0.) ? lo : hi;
        Real fu = (amrex::Math::abs(vad) < small_vel) ? 0.0 : 1.0;
        Imy(i, j, k, n) = fu*st + (1.0 - fu)*0.5*(hi + lo); // store yedge
    },
    zebox, ncomp, [=] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
    {

        Real lo = Ipz(i,j,k-1,n);
        Real hi = Imz(i,j,k  ,n);

        if (l_use_forces_in_trans)
        {
            lo += 0.5*l_dt*f(i,j,k-1,n);
            hi += 0.5*l_dt*f(i,j,k  ,n);
        }

        Real wad = w_ad(i,j,k);
        auto bc = pbc[n];

        GodunovTransBC::SetTransTermZBCs(i, j, k, n, q, lo, hi, bc.lo(2), bc.hi(2), dlo.z, dhi.z, true);

        zlo(i,j,k,n) = lo;
        zhi(i,j,k,n) = hi;

        Real st = (wad >= 0.) ? lo : hi;
        Real fu = (amrex::Math::abs(wad) < small_vel) ? 0.0 : 1.0;
        Imz(i, j, k, n) = fu*st + (1.0 - fu)*0.5*(hi + lo); // store zedge
    }
    );


    Array4<Real> xedge = Imx;
    Array4<Real> yedge = Imy;
    Array4<Real> zedge = Imz;

    Array4<Real> divu = makeArray4(Ipx.dataPtr(), grow(bx,1), 1);
    amrex::ParallelFor(Box(divu), [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept {
        divu(i,j,k) = 0.0;
    });

    //
    // X-Flux
    //
    Box const xbxtmp = Box(xbx).enclosedCells().grow(0,1);
    Array4<Real> yzlo = makeArray4(Ipy.dataPtr(), amrex::surroundingNodes(xbxtmp,1), 1);
    Array4<Real> zylo = makeArray4(Ipz.dataPtr(), amrex::surroundingNodes(xbxtmp,2), 1);

    // Add d/dy term to z-faces
    // Start with {zlo,zhi} --> {zylo, zyhi} and upwind using w_ad to {zylo}
    // Add d/dz to y-faces
    // Start with {ylo,yhi} --> {yzlo, yzhi} and upwind using v_ad to {yzlo}
    amrex::ParallelFor(Box(zylo), Box(yzlo),
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        constexpr int n = 0;
        const auto bc = pbc[n];
        Real l_zylo, l_zyhi;
        GodunovCornerCouple::AddCornerCoupleTermZY(l_zylo, l_zyhi,
                              i, j, k, n, l_dt, dy, false,
                              zlo(i,j,k,n), zhi(i,j,k,n),
                              q, divu, v_ad, yedge);

        Real wad = w_ad(i,j,k);
        GodunovTransBC::SetTransTermZBCs(i, j, k, n, q, l_zylo, l_zyhi, bc.lo(2), bc.hi(2), dlo.z, dhi.z, true);


        Real st = (wad >= 0.) ? l_zylo : l_zyhi;
        Real fu = (amrex::Math::abs(wad) < small_vel) ? 0.0 : 1.0;
        zylo(i,j,k) = fu*st + (1.0 - fu) * 0.5 * (l_zyhi + l_zylo);
    },
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        constexpr int n = 0;
        const auto bc = pbc[n];
        Real l_yzlo, l_yzhi;
        GodunovCornerCouple::AddCornerCoupleTermYZ(l_yzlo, l_yzhi,
                              i, j, k, n, l_dt, dz, false,
                              ylo(i,j,k,n), yhi(i,j,k,n),
                              q, divu, w_ad, zedge);

        Real vad = v_ad(i,j,k);
        GodunovTransBC::SetTransTermYBCs(i, j, k, n, q, l_yzlo, l_yzhi, bc.lo(1), bc.hi(1), dlo.y, dhi.y, true);

        Real st = (vad >= 0.) ? l_yzlo : l_yzhi;
        Real fu = (amrex::Math::abs(vad) < small_vel) ? 0.0 : 1.0;
        yzlo(i,j,k) = fu*st + (1.0 - fu) * 0.5 * (l_yzhi + l_yzlo);
    });

    //
    amrex::ParallelFor(xbx, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        constexpr int n = 0;
        auto bc = pbc[n];

        Real stl = xlo(i,j,k,n) - (0.25*l_dt/dy)*(v_ad(i-1,j+1,k  )+v_ad(i-1,j,k))*
                                                 (yzlo(i-1,j+1,k  )-yzlo(i-1,j,k))
                                - (0.25*l_dt/dz)*(w_ad(i-1,j  ,k+1)+w_ad(i-1,j,k))*
                                                 (zylo(i-1,j  ,k+1)-zylo(i-1,j,k));
        Real sth = xhi(i,j,k,n) - (0.25*l_dt/dy)*(v_ad(i  ,j+1,k  )+v_ad(i  ,j,k))*
                                                 (yzlo(i  ,j+1,k  )-yzlo(i  ,j,k))
                                - (0.25*l_dt/dz)*(w_ad(i  ,j  ,k+1)+w_ad(i  ,j,k))*
                                                 (zylo(i  ,j  ,k+1)-zylo(i  ,j,k));

        if (!l_use_forces_in_trans)
        {
            stl += 0.5 * l_dt * f(i-1,j,k,n);
            sth += 0.5 * l_dt * f(i  ,j,k,n);
        }

        HydroBC::SetXEdgeBCs(i, j, k, n, q, stl, sth, bc.lo(0), dlo.x, bc.hi(0), dhi.x, true);

        if ( (i==dlo.x) && (bc.lo(0) == BCType::foextrap || bc.lo(0) == BCType::hoextrap) )
        {
            sth = amrex::min(sth,0.0_rt);
            stl = sth;
        }
        if ( (i==dhi.x+1) && (bc.hi(0) == BCType::foextrap || bc.hi(0) == BCType::hoextrap) )
        {
             stl = amrex::max(stl,0.0_rt);
             sth = stl;
        }

        Real st = ( (stl+sth) >= 0.) ? stl : sth;
        bool ltm = ( (stl <= 0. && sth >= 0.) || (amrex::Math::abs(stl+sth) < small_vel) );
        qx(i,j,k) = ltm ? 0. : st;
    });

    //
    // Y-Flux
    //
    Box const ybxtmp = Box(ybx).enclosedCells().grow(1,1);
    Array4<Real> xzlo = makeArray4(Ipy.dataPtr(), amrex::surroundingNodes(ybxtmp,0), 1);
    Array4<Real> zxlo = makeArray4(Ipz.dataPtr(), amrex::surroundingNodes(ybxtmp,2), 1);

    // Add d/dz to x-faces
    // Start with {xlo,xhi} --> {xzlo, xzhi} and upwind using u_ad to {xzlo}
    // Add d/dx term to z-faces
    // Start with {zlo,zhi} --> {zxlo, zxhi} and upwind using w_ad to {zxlo}
    amrex::ParallelFor(Box(xzlo), Box(zxlo),
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        constexpr int n = 1;
        const auto bc = pbc[n];
        Real l_xzlo, l_xzhi;
        GodunovCornerCouple::AddCornerCoupleTermXZ(l_xzlo, l_xzhi,
                              i, j, k, n, l_dt, dz, false,
                              xlo(i,j,k,n),  xhi(i,j,k,n),
                              q, divu, w_ad, zedge);

        Real uad = u_ad(i,j,k);
        GodunovTransBC::SetTransTermXBCs(i, j, k, n, q, l_xzlo, l_xzhi, bc.lo(0), bc.hi(0), dlo.x, dhi.x, true);


        Real st = (uad >= 0.) ? l_xzlo : l_xzhi;
        Real fu = (amrex::Math::abs(uad) < small_vel) ? 0.0 : 1.0;
        xzlo(i,j,k) = fu*st + (1.0 - fu) * 0.5 * (l_xzhi + l_xzlo);
    },
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        constexpr int n = 1;
        const auto bc = pbc[n];
        Real l_zxlo, l_zxhi;
        GodunovCornerCouple::AddCornerCoupleTermZX(l_zxlo, l_zxhi,
                              i, j, k, n, l_dt, dx, false,
                              zlo(i,j,k,n), zhi(i,j,k,n),
                              q, divu, u_ad, xedge);

        Real wad = w_ad(i,j,k);
        GodunovTransBC::SetTransTermZBCs(i, j, k, n, q, l_zxlo, l_zxhi, bc.lo(2), bc.hi(2), dlo.z, dhi.z, true);

        Real st = (wad >= 0.) ? l_zxlo : l_zxhi;
        Real fu = (amrex::Math::abs(wad) < small_vel) ? 0.0 : 1.0;
        zxlo(i,j,k) = fu*st + (1.0 - fu) * 0.5 * (l_zxhi + l_zxlo);
    });

    //
    amrex::ParallelFor(ybx, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        constexpr int n = 1;
        auto bc = pbc[n];

        Real stl = ylo(i,j,k,n) - (0.25*l_dt/dx)*(u_ad(i+1,j-1,k  )+u_ad(i,j-1,k))*
                                                 (xzlo(i+1,j-1,k  )-xzlo(i,j-1,k))
                                - (0.25*l_dt/dz)*(w_ad(i  ,j-1,k+1)+w_ad(i,j-1,k))*
                                                 (zxlo(i  ,j-1,k+1)-zxlo(i,j-1,k));
        Real sth = yhi(i,j,k,n) - (0.25*l_dt/dx)*(u_ad(i+1,j  ,k  )+u_ad(i,j  ,k))*
                                                 (xzlo(i+1,j  ,k  )-xzlo(i,j  ,k))
                                - (0.25*l_dt/dz)*(w_ad(i  ,j  ,k+1)+w_ad(i,j  ,k))*
                                                 (zxlo(i  ,j  ,k+1)-zxlo(i,j  ,k));


        if (!l_use_forces_in_trans)
        {
           stl += 0.5 * l_dt * f(i,j-1,k,n);
           sth += 0.5 * l_dt * f(i,j  ,k,n);
        }

        HydroBC::SetYEdgeBCs(i, j, k, n, q, stl, sth, bc.lo(1), dlo.y, bc.hi(1), dhi.y, true);

        if ( (j==dlo.y) && (bc.lo(1) == BCType::foextrap || bc.lo(1) == BCType::hoextrap) )
        {
            sth = amrex::min(sth,0.0_rt);
            stl = sth;
        }
        if ( (j==dhi.y+1) && (bc.hi(1) == BCType::foextrap || bc.hi(1) == BCType::hoextrap) )
        {
            stl = amrex::max(stl,0.0_rt);
            sth = stl;
        }

        Real st = ( (stl+sth) >= 0.) ? stl : sth;
        bool ltm = ( (stl <= 0. && sth >= 0.) || (amrex::Math::abs(stl+sth) < small_vel) );
        qy(i,j,k) = ltm ? 0. : st;
    });


    //
    // Z-Flux
    //
    Box const zbxtmp = Box(zbx).enclosedCells().grow(2,1);
    Array4<Real> xylo = makeArray4(Ipy.dataPtr(), amrex::surroundingNodes(zbxtmp,0), 1);
    Array4<Real> yxlo = makeArray4(Ipz.dataPtr(), amrex::surroundingNodes(zbxtmp,1), 1);

    amrex::ParallelFor(Box(xylo), Box(yxlo),
    //
    // Add d/dy term to x-faces
    // Start with {xlo,xhi} --> {xylo, xyhi} and upwind using u_ad to {xylo}
    //
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        constexpr int n = 2;
        const auto bc = pbc[n];
        Real l_xylo, l_xyhi;
        GodunovCornerCouple::AddCornerCoupleTermXY(l_xylo, l_xyhi,
                              i, j, k, n, l_dt, dy, false,
                              xlo(i,j,k,n), xhi(i,j,k,n),
                              q, divu, v_ad, yedge);

        Real uad = u_ad(i,j,k);
        GodunovTransBC::SetTransTermXBCs(i, j, k, n, q, l_xylo, l_xyhi, bc.lo(0), bc.hi(0), dlo.x, dhi.x, true);


        Real st = (uad >= 0.) ? l_xylo : l_xyhi;
        Real fu = (amrex::Math::abs(uad) < small_vel) ? 0.0 : 1.0;
        xylo(i,j,k) = fu*st + (1.0 - fu) * 0.5 * (l_xyhi + l_xylo);
    },
    //
    // Add d/dx term to y-faces
    // Start with {ylo,yhi} --> {yxlo, yxhi} and upwind using v_ad to {yxlo}
    //
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        constexpr int n = 2;
        const auto bc = pbc[n];
        Real l_yxlo, l_yxhi;
        GodunovCornerCouple::AddCornerCoupleTermYX(l_yxlo, l_yxhi,
                              i, j, k, n, l_dt, dx, false,
                              ylo(i,j,k,n), yhi(i,j,k,n),
                              q, divu, u_ad, xedge);

        Real vad = v_ad(i,j,k);
        GodunovTransBC::SetTransTermYBCs(i, j, k, n, q, l_yxlo, l_yxhi, bc.lo(1), bc.hi(1), dlo.y, dhi.y, true);


        Real st = (vad >= 0.) ? l_yxlo : l_yxhi;
        Real fu = (amrex::Math::abs(vad) < small_vel) ? 0.0 : 1.0;
        yxlo(i,j,k) = fu*st + (1.0 - fu) * 0.5 * (l_yxhi + l_yxlo);
    });
    //
    amrex::ParallelFor(zbx, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        constexpr int n = 2;
        auto bc = pbc[n];
        Real stl = zlo(i,j,k,n) - (0.25*l_dt/dx)*(u_ad(i+1,j  ,k-1)+u_ad(i,j,k-1))*
                                                 (xylo(i+1,j  ,k-1)-xylo(i,j,k-1))
                                - (0.25*l_dt/dy)*(v_ad(i  ,j+1,k-1)+v_ad(i,j,k-1))*
                                                 (yxlo(i  ,j+1,k-1)-yxlo(i,j,k-1));
        Real sth = zhi(i,j,k,n) - (0.25*l_dt/dx)*(u_ad(i+1,j  ,k  )+u_ad(i,j,k  ))*
                                                 (xylo(i+1,j  ,k  )-xylo(i,j,k  ))
                                - (0.25*l_dt/dy)*(v_ad(i  ,j+1,k  )+v_ad(i,j,k  ))*
                                                 (yxlo(i  ,j+1,k  )-yxlo(i,j,k  ));

        if (!l_use_forces_in_trans)
        {
           stl += 0.5 * l_dt * f(i,j,k-1,n);
           sth += 0.5 * l_dt * f(i,j,k  ,n);
        }

        HydroBC::SetZEdgeBCs(i, j, k, n, q, stl, sth, bc.lo(2), dlo.z, bc.hi(2), dhi.z, true);

        if ( (k==dlo.z) && (bc.lo(2) == BCType::foextrap || bc.lo(2) == BCType::hoextrap) )
        {
            sth = amrex::min(sth,0.0_rt);
            stl = sth;
        }
        if ( (k==dhi.z+1) && (bc.hi(2) == BCType::foextrap || bc.hi(2) == BCType::hoextrap) )
        {
            stl = amrex::max(stl,0.0_rt);
            sth = stl;
        }

        Real st = ( (stl+sth) >= 0.) ? stl : sth;
        bool ltm = ( (stl <= 0. && sth >= 0.) || (amrex::Math::abs(stl+sth) < small_vel) );
        qz(i,j,k) = ltm ? 0. : st;
    });
}